

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  Geometry *geometry;
  long lVar59;
  ulong uVar60;
  bool bVar61;
  undefined8 unaff_R13;
  ulong uVar62;
  long lVar63;
  byte bVar64;
  float fVar65;
  float fVar125;
  float fVar127;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar66;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar131;
  float fVar132;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined4 uVar133;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined8 uVar139;
  vint4 bi_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  vint4 ai;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  vint4 ai_2;
  undefined1 auVar170 [32];
  float fVar171;
  uint uVar172;
  float fVar174;
  float fVar175;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_680;
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  LinearSpace3fa *local_5d0;
  Primitive *local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined8 local_440;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  uint local_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  uint uStack_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar56 = (ulong)(byte)prim[1];
  lVar63 = uVar56 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 4 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 5 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 6 + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0xf + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x11 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1a + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1b + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 * 0x1c + 6)));
  uVar133 = *(undefined4 *)(prim + lVar63 + 0x12);
  auVar187._4_4_ = uVar133;
  auVar187._0_4_ = uVar133;
  auVar187._8_4_ = uVar133;
  auVar187._12_4_ = uVar133;
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar67 = vsubps_avx512vl(auVar80,*(undefined1 (*) [16])(prim + lVar63 + 6));
  fVar149 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar63 + 0x16)) *
            *(float *)(prim + lVar63 + 0x1a);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar56 * 7 + 6);
  auVar86 = vpmovsxwd_avx(auVar80);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar22 = vpmovsxwd_avx(auVar85);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar56 * 9 + 6);
  auVar23 = vpmovsxwd_avx(auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar56 * 0xd + 6);
  auVar134 = vpmovsxwd_avx(auVar81);
  auVar68 = vpbroadcastd_avx512vl();
  auVar80 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar80 = vinsertps_avx512f(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar67 = vmulps_avx512vl(auVar187,auVar67);
  auVar69 = vmulps_avx512vl(auVar187,auVar80);
  auVar70 = vcvtdq2ps_avx512vl(auVar21);
  auVar71 = vcvtdq2ps_avx512vl(auVar76);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar80 = vcvtdq2ps_avx(auVar75);
  auVar85 = vcvtdq2ps_avx(auVar77);
  auVar82 = vcvtdq2ps_avx(auVar78);
  auVar81 = vcvtdq2ps_avx(auVar79);
  uVar133 = auVar69._0_4_;
  auVar178._4_4_ = uVar133;
  auVar178._0_4_ = uVar133;
  auVar178._8_4_ = uVar133;
  auVar178._12_4_ = uVar133;
  auVar21 = vshufps_avx(auVar69,auVar69,0x55);
  auVar76 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar75 = vmulps_avx512vl(auVar76,auVar72);
  auVar140._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar140._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar140._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar140._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar69._0_4_ = auVar81._0_4_ * auVar76._0_4_;
  auVar69._4_4_ = auVar81._4_4_ * auVar76._4_4_;
  auVar69._8_4_ = auVar81._8_4_ * auVar76._8_4_;
  auVar69._12_4_ = auVar81._12_4_ * auVar76._12_4_;
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar21,auVar71);
  auVar75 = vfmadd231ps_avx512vl(auVar140,auVar21,auVar74);
  auVar21 = vfmadd231ps_fma(auVar69,auVar82,auVar21);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar178,auVar70);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar178,auVar73);
  auVar21 = vfmadd231ps_fma(auVar21,auVar85,auVar178);
  auVar77 = vbroadcastss_avx512vl(auVar67);
  auVar78 = vshufps_avx512vl(auVar67,auVar67,0x55);
  auVar79 = vshufps_avx512vl(auVar67,auVar67,0xaa);
  auVar72 = vmulps_avx512vl(auVar79,auVar72);
  auVar80 = vmulps_avx512vl(auVar79,auVar80);
  auVar81 = vmulps_avx512vl(auVar79,auVar81);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar78,auVar71);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar78,auVar74);
  auVar82 = vfmadd231ps_avx512vl(auVar81,auVar78,auVar82);
  auVar70 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar70);
  auVar71 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar73);
  auVar69 = vfmadd231ps_fma(auVar82,auVar77,auVar85);
  auVar185._8_4_ = 0x7fffffff;
  auVar185._0_8_ = 0x7fffffff7fffffff;
  auVar185._12_4_ = 0x7fffffff;
  auVar80 = vandps_avx(auVar185,auVar76);
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar80,auVar182,1);
  bVar61 = (bool)((byte)uVar62 & 1);
  auVar67._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._0_4_;
  bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._4_4_;
  bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._8_4_;
  bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar76._12_4_;
  auVar80 = vandps_avx(auVar185,auVar75);
  uVar62 = vcmpps_avx512vl(auVar80,auVar182,1);
  bVar61 = (bool)((byte)uVar62 & 1);
  auVar83._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._0_4_;
  bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._4_4_;
  bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._8_4_;
  bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar75._12_4_;
  auVar80 = vandps_avx(auVar185,auVar21);
  uVar62 = vcmpps_avx512vl(auVar80,auVar182,1);
  bVar61 = (bool)((byte)uVar62 & 1);
  auVar84._0_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar21._0_4_;
  bVar61 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar21._4_4_;
  bVar61 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar21._8_4_;
  bVar61 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar61 * 0x219392ef | (uint)!bVar61 * auVar21._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar67);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar67,auVar85,auVar183);
  auVar81 = vfmadd132ps_fma(auVar80,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar80 = vfnmadd213ps_fma(auVar83,auVar85,auVar183);
  auVar79 = vfmadd132ps_fma(auVar80,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar80 = vfnmadd213ps_fma(auVar84,auVar85,auVar183);
  auVar67 = vfmadd132ps_fma(auVar80,auVar85,auVar85);
  auVar154._4_4_ = fVar149;
  auVar154._0_4_ = fVar149;
  auVar154._8_4_ = fVar149;
  auVar154._12_4_ = fVar149;
  auVar80 = vcvtdq2ps_avx(auVar86);
  auVar85 = vcvtdq2ps_avx(auVar22);
  auVar85 = vsubps_avx(auVar85,auVar80);
  auVar86 = vfmadd213ps_fma(auVar85,auVar154,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar23);
  auVar85 = vcvtdq2ps_avx(auVar134);
  auVar85 = vsubps_avx(auVar85,auVar80);
  auVar22 = vfmadd213ps_fma(auVar85,auVar154,auVar80);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar56 * 0x12 + 6);
  auVar80 = vpmovsxwd_avx(auVar21);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar56 * 0x16 + 6);
  auVar85 = vpmovsxwd_avx(auVar76);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar82 = vsubps_avx(auVar85,auVar80);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar56 * 0x14 + 6);
  auVar85 = vpmovsxwd_avx(auVar72);
  auVar82 = vfmadd213ps_fma(auVar82,auVar154,auVar80);
  auVar80 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar56 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar73);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar80);
  auVar21 = vfmadd213ps_fma(auVar85,auVar154,auVar80);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar56 * 0x1d + 6);
  auVar80 = vpmovsxwd_avx(auVar74);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar56 * 0x21 + 6);
  auVar85 = vpmovsxwd_avx(auVar75);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar80);
  auVar76 = vfmadd213ps_fma(auVar85,auVar154,auVar80);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar56 * 0x1f + 6);
  auVar80 = vpmovsxwd_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar56 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar78);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar80);
  auVar85 = vfmadd213ps_fma(auVar85,auVar154,auVar80);
  auVar80 = vsubps_avx(auVar86,auVar70);
  auVar155._0_4_ = auVar81._0_4_ * auVar80._0_4_;
  auVar155._4_4_ = auVar81._4_4_ * auVar80._4_4_;
  auVar155._8_4_ = auVar81._8_4_ * auVar80._8_4_;
  auVar155._12_4_ = auVar81._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar22,auVar70);
  auVar145._0_4_ = auVar81._0_4_ * auVar80._0_4_;
  auVar145._4_4_ = auVar81._4_4_ * auVar80._4_4_;
  auVar145._8_4_ = auVar81._8_4_ * auVar80._8_4_;
  auVar145._12_4_ = auVar81._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar82,auVar71);
  auVar162._0_4_ = auVar79._0_4_ * auVar80._0_4_;
  auVar162._4_4_ = auVar79._4_4_ * auVar80._4_4_;
  auVar162._8_4_ = auVar79._8_4_ * auVar80._8_4_;
  auVar162._12_4_ = auVar79._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar21,auVar71);
  auVar70._0_4_ = auVar79._0_4_ * auVar80._0_4_;
  auVar70._4_4_ = auVar79._4_4_ * auVar80._4_4_;
  auVar70._8_4_ = auVar79._8_4_ * auVar80._8_4_;
  auVar70._12_4_ = auVar79._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar76,auVar69);
  auVar71._0_4_ = auVar67._0_4_ * auVar80._0_4_;
  auVar71._4_4_ = auVar67._4_4_ * auVar80._4_4_;
  auVar71._8_4_ = auVar67._8_4_ * auVar80._8_4_;
  auVar71._12_4_ = auVar67._12_4_ * auVar80._12_4_;
  auVar80 = vsubps_avx(auVar85,auVar69);
  auVar134._0_4_ = auVar67._0_4_ * auVar80._0_4_;
  auVar134._4_4_ = auVar67._4_4_ * auVar80._4_4_;
  auVar134._8_4_ = auVar67._8_4_ * auVar80._8_4_;
  auVar134._12_4_ = auVar67._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar155,auVar145);
  auVar85 = vpminsd_avx(auVar162,auVar70);
  auVar80 = vmaxps_avx(auVar80,auVar85);
  auVar85 = vpminsd_avx(auVar71,auVar134);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar79._4_4_ = uVar133;
  auVar79._0_4_ = uVar133;
  auVar79._8_4_ = uVar133;
  auVar79._12_4_ = uVar133;
  auVar85 = vmaxps_avx512vl(auVar85,auVar79);
  auVar80 = vmaxps_avx(auVar80,auVar85);
  auVar86._8_4_ = 0x3f7ffffa;
  auVar86._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar86._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar80,auVar86);
  auVar80 = vpmaxsd_avx(auVar155,auVar145);
  auVar85 = vpmaxsd_avx(auVar162,auVar70);
  auVar80 = vminps_avx(auVar80,auVar85);
  auVar85 = vpmaxsd_avx(auVar71,auVar134);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar22._4_4_ = uVar133;
  auVar22._0_4_ = uVar133;
  auVar22._8_4_ = uVar133;
  auVar22._12_4_ = uVar133;
  auVar85 = vminps_avx512vl(auVar85,auVar22);
  auVar80 = vminps_avx(auVar80,auVar85);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar23);
  uVar139 = vcmpps_avx512vl(local_3d0,auVar80,2);
  uVar24 = vpcmpgtd_avx512vl(auVar68,_DAT_01f4ad30);
  uVar62 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar139 & 0xf & (byte)uVar24));
  local_5d0 = pre->ray_space + k;
  local_2a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5c8 = prim;
  for (; uVar62 != 0; uVar62 = (ulong)((uint)uVar62 & (uint)uVar62 + 0xf & (uint)uVar139)) {
    lVar63 = 0;
    for (uVar56 = uVar62; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      lVar63 = lVar63 + 1;
    }
    uVar6 = *(uint *)(local_5c8 + 2);
    pGVar8 = (context->scene->geometries).items[uVar6].ptr;
    uVar56 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)*(uint *)(local_5c8 + lVar63 * 4 + 6) *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar149 = (pGVar8->time_range).lower;
    fVar149 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar149) / ((pGVar8->time_range).upper - fVar149));
    auVar80 = vroundss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149),9);
    auVar80 = vminss_avx(auVar80,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,auVar80);
    fVar149 = fVar149 - auVar80._0_4_;
    fVar171 = 1.0 - fVar149;
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar57 = (long)(int)auVar80._0_4_ * 0x38;
    lVar59 = *(long *)(_Var9 + 0x10 + lVar57);
    lVar10 = *(long *)(_Var9 + 0x38 + lVar57);
    lVar11 = *(long *)(_Var9 + 0x48 + lVar57);
    auVar68._4_4_ = fVar149;
    auVar68._0_4_ = fVar149;
    auVar68._8_4_ = fVar149;
    auVar68._12_4_ = fVar149;
    pfVar3 = (float *)(lVar10 + lVar11 * uVar56);
    auVar180._0_4_ = fVar149 * *pfVar3;
    auVar180._4_4_ = fVar149 * pfVar3[1];
    auVar180._8_4_ = fVar149 * pfVar3[2];
    auVar180._12_4_ = fVar149 * pfVar3[3];
    lVar63 = uVar56 + 1;
    auVar80 = vmulps_avx512vl(auVar68,*(undefined1 (*) [16])(lVar10 + lVar11 * lVar63));
    p_Var12 = pGVar8[4].occlusionFilterN;
    auVar141._4_4_ = fVar171;
    auVar141._0_4_ = fVar171;
    auVar141._8_4_ = fVar171;
    auVar141._12_4_ = fVar171;
    local_630 = vfmadd231ps_fma(auVar180,auVar141,
                                *(undefined1 (*) [16])(*(long *)(_Var9 + lVar57) + lVar59 * uVar56))
    ;
    _local_470 = vfmadd231ps_avx512vl
                           (auVar80,auVar141,
                            *(undefined1 (*) [16])(*(long *)(_Var9 + lVar57) + lVar59 * lVar63));
    pfVar3 = (float *)(*(long *)(p_Var12 + lVar57 + 0x38) +
                      uVar56 * *(long *)(p_Var12 + lVar57 + 0x48));
    auVar181._0_4_ = fVar149 * *pfVar3;
    auVar181._4_4_ = fVar149 * pfVar3[1];
    auVar181._8_4_ = fVar149 * pfVar3[2];
    auVar181._12_4_ = fVar149 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var12 + lVar57 + 0x38) +
                      *(long *)(p_Var12 + lVar57 + 0x48) * lVar63);
    auVar186._0_4_ = fVar149 * *pfVar3;
    auVar186._4_4_ = fVar149 * pfVar3[1];
    auVar186._8_4_ = fVar149 * pfVar3[2];
    auVar186._12_4_ = fVar149 * pfVar3[3];
    auVar85 = vfmadd231ps_fma(auVar181,auVar141,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var12 + lVar57) +
                               *(long *)(p_Var12 + lVar57 + 0x10) * uVar56));
    auVar82 = vfmadd231ps_fma(auVar186,auVar141,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var12 + lVar57) +
                               *(long *)(p_Var12 + lVar57 + 0x10) * lVar63));
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar142._8_4_ = 0xbeaaaaab;
    auVar142._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar142._12_4_ = 0xbeaaaaab;
    local_640 = vfnmadd213ps_fma(auVar85,auVar142,local_630);
    local_650 = vfmadd213ps_avx512vl(auVar82,auVar142,_local_470);
    auVar82 = vsubps_avx(local_630,auVar80);
    uVar133 = auVar82._0_4_;
    auVar146._4_4_ = uVar133;
    auVar146._0_4_ = uVar133;
    auVar146._8_4_ = uVar133;
    auVar146._12_4_ = uVar133;
    auVar85 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    aVar4 = (local_5d0->vx).field_0;
    aVar5 = (local_5d0->vy).field_0;
    fVar149 = (local_5d0->vz).field_0.m128[0];
    fVar171 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
    fVar174 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
    fVar175 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
    auVar173._0_4_ = fVar149 * auVar82._0_4_;
    auVar173._4_4_ = fVar171 * auVar82._4_4_;
    auVar173._8_4_ = fVar174 * auVar82._8_4_;
    auVar173._12_4_ = fVar175 * auVar82._12_4_;
    auVar85 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar85);
    auVar81 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar146);
    auVar82 = vsubps_avx(local_640,auVar80);
    uVar133 = auVar82._0_4_;
    auVar147._4_4_ = uVar133;
    auVar147._0_4_ = uVar133;
    auVar147._8_4_ = uVar133;
    auVar147._12_4_ = uVar133;
    auVar85 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar176._0_4_ = fVar149 * auVar82._0_4_;
    auVar176._4_4_ = fVar171 * auVar82._4_4_;
    auVar176._8_4_ = fVar174 * auVar82._8_4_;
    auVar176._12_4_ = fVar175 * auVar82._12_4_;
    auVar85 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar85);
    auVar21 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar147);
    auVar82 = vsubps_avx(local_650,auVar80);
    uVar133 = auVar82._0_4_;
    auVar148._4_4_ = uVar133;
    auVar148._0_4_ = uVar133;
    auVar148._8_4_ = uVar133;
    auVar148._12_4_ = uVar133;
    auVar85 = vshufps_avx(auVar82,auVar82,0x55);
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar179._0_4_ = fVar149 * auVar82._0_4_;
    auVar179._4_4_ = fVar171 * auVar82._4_4_;
    auVar179._8_4_ = fVar174 * auVar82._8_4_;
    auVar179._12_4_ = fVar175 * auVar82._12_4_;
    auVar85 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar85);
    auVar76 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar148);
    auVar85 = vsubps_avx512vl(_local_470,auVar80);
    uVar133 = auVar85._0_4_;
    auVar143._4_4_ = uVar133;
    auVar143._0_4_ = uVar133;
    auVar143._8_4_ = uVar133;
    auVar143._12_4_ = uVar133;
    auVar80 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar184._0_4_ = fVar149 * auVar85._0_4_;
    auVar184._4_4_ = fVar171 * auVar85._4_4_;
    auVar184._8_4_ = fVar174 * auVar85._8_4_;
    auVar184._12_4_ = fVar175 * auVar85._12_4_;
    auVar80 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar80);
    auVar72 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar4,auVar143);
    lVar63 = (long)iVar7 * 0x44;
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar63);
    uVar133 = auVar81._0_4_;
    local_4c0._4_4_ = uVar133;
    local_4c0._0_4_ = uVar133;
    local_4c0._8_4_ = uVar133;
    local_4c0._12_4_ = uVar133;
    local_4c0._16_4_ = uVar133;
    local_4c0._20_4_ = uVar133;
    local_4c0._24_4_ = uVar133;
    local_4c0._28_4_ = uVar133;
    auVar87._8_4_ = 1;
    auVar87._0_8_ = 0x100000001;
    auVar87._12_4_ = 1;
    auVar87._16_4_ = 1;
    auVar87._20_4_ = 1;
    auVar87._24_4_ = 1;
    auVar87._28_4_ = 1;
    local_4e0 = vpermps_avx2(auVar87,ZEXT1632(auVar81));
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x484);
    uVar133 = auVar21._0_4_;
    local_540._4_4_ = uVar133;
    local_540._0_4_ = uVar133;
    local_540._8_4_ = uVar133;
    local_540._12_4_ = uVar133;
    local_540._16_4_ = uVar133;
    local_540._20_4_ = uVar133;
    local_540._24_4_ = uVar133;
    local_540._28_4_ = uVar133;
    local_500 = vpermps_avx512vl(auVar87,ZEXT1632(auVar21));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x908);
    local_560 = vbroadcastss_avx512vl(auVar76);
    local_580 = vpermps_avx512vl(auVar87,ZEXT1632(auVar76));
    auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0xd8c);
    fVar171 = auVar72._0_4_;
    local_520._4_4_ = fVar171;
    local_520._0_4_ = fVar171;
    local_520._8_4_ = fVar171;
    local_520._12_4_ = fVar171;
    local_520._16_4_ = fVar171;
    local_520._20_4_ = fVar171;
    local_520._24_4_ = fVar171;
    local_520._28_4_ = fVar171;
    local_5a0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar72));
    auVar87 = vmulps_avx512vl(local_520,auVar99);
    auVar88 = vmulps_avx512vl(local_5a0,auVar99);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,local_560);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar100,local_580);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_540);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_500);
    auVar89 = vfmadd231ps_avx512vl(auVar87,auVar101,local_4c0);
    auVar90 = vfmadd231ps_avx512vl(auVar88,auVar101,local_4e0);
    auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar63);
    auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x484);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x908);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0xd8c);
    auVar91 = vmulps_avx512vl(local_520,auVar97);
    auVar92 = vmulps_avx512vl(local_5a0,auVar97);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_560);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_580);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_540);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_500);
    auVar73 = vfmadd231ps_fma(auVar91,auVar87,local_4c0);
    auVar74 = vfmadd231ps_fma(auVar92,auVar87,local_4e0);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar73),auVar89);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar74),auVar90);
    auVar93 = vmulps_avx512vl(auVar90,auVar91);
    auVar94 = vmulps_avx512vl(auVar89,auVar92);
    auVar93 = vsubps_avx512vl(auVar93,auVar94);
    auVar80 = vshufps_avx(local_630,local_630,0xff);
    uVar139 = auVar80._0_8_;
    local_80._8_8_ = uVar139;
    local_80._0_8_ = uVar139;
    local_80._16_8_ = uVar139;
    local_80._24_8_ = uVar139;
    auVar80 = vshufps_avx(local_640,local_640,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar80);
    auVar80 = vshufps_avx(local_650,local_650,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar80);
    auVar80 = vshufps_avx512vl(_local_470,_local_470,0xff);
    uVar139 = auVar80._0_8_;
    register0x000012c8 = uVar139;
    local_e0 = uVar139;
    register0x000012d0 = uVar139;
    register0x000012d8 = uVar139;
    auVar94 = vmulps_avx512vl(_local_e0,auVar99);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_a0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_80);
    auVar95 = vmulps_avx512vl(_local_e0,auVar97);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,local_c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,local_a0);
    auVar75 = vfmadd231ps_fma(auVar95,auVar87,local_80);
    auVar95 = vmulps_avx512vl(auVar92,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar91);
    auVar96 = vmaxps_avx512vl(auVar94,ZEXT1632(auVar75));
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar95 = vmulps_avx512vl(auVar96,auVar95);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    uVar139 = vcmpps_avx512vl(auVar93,auVar95,2);
    auVar80 = vblendps_avx(auVar81,local_630,8);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar85 = vandps_avx512vl(auVar80,auVar82);
    auVar80 = vblendps_avx(auVar21,local_640,8);
    auVar80 = vandps_avx512vl(auVar80,auVar82);
    auVar85 = vmaxps_avx(auVar85,auVar80);
    auVar80 = vblendps_avx(auVar76,local_650,8);
    auVar77 = vandps_avx512vl(auVar80,auVar82);
    auVar80 = vblendps_avx(auVar72,_local_470,8);
    auVar80 = vandps_avx512vl(auVar80,auVar82);
    auVar80 = vmaxps_avx(auVar77,auVar80);
    auVar80 = vmaxps_avx(auVar85,auVar80);
    auVar85 = vmovshdup_avx(auVar80);
    auVar85 = vmaxss_avx(auVar85,auVar80);
    auVar80 = vshufpd_avx(auVar80,auVar80,1);
    auVar82 = vcvtsi2ss_avx512f(_local_470,iVar7);
    auVar80 = vmaxss_avx(auVar80,auVar85);
    local_400._0_16_ = auVar82;
    fVar149 = auVar82._0_4_;
    auVar95._4_4_ = fVar149;
    auVar95._0_4_ = fVar149;
    auVar95._8_4_ = fVar149;
    auVar95._12_4_ = fVar149;
    auVar95._16_4_ = fVar149;
    auVar95._20_4_ = fVar149;
    auVar95._24_4_ = fVar149;
    auVar95._28_4_ = fVar149;
    uVar24 = vcmpps_avx512vl(auVar95,_DAT_01f7b060,0xe);
    bVar64 = (byte)uVar139 & (byte)uVar24;
    auVar80 = vmulss_avx512f(auVar80,ZEXT416(0x35000000));
    auVar93._8_4_ = 2;
    auVar93._0_8_ = 0x200000002;
    auVar93._12_4_ = 2;
    auVar93._16_4_ = 2;
    auVar93._20_4_ = 2;
    auVar93._24_4_ = 2;
    auVar93._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar93,ZEXT1632(auVar81));
    local_120 = vpermps_avx512vl(auVar93,ZEXT1632(auVar21));
    local_140 = vpermps_avx512vl(auVar93,ZEXT1632(auVar76));
    local_620 = vpermps_avx2(auVar93,ZEXT1632(auVar72));
    local_280 = vpbroadcastd_avx512vl();
    uVar172 = *(uint *)(ray + k * 4 + 0x60);
    auVar85 = local_100._0_16_;
    if (bVar64 == 0) {
      bVar61 = false;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar190 = ZEXT3264(auVar101);
      auVar85 = vxorps_avx512vl(auVar85,auVar85);
      auVar191 = ZEXT1664(auVar85);
      auVar192 = ZEXT3264(local_4c0);
      auVar193 = ZEXT3264(local_4e0);
      auVar194 = ZEXT3264(local_540);
      auVar195 = ZEXT3264(local_500);
      auVar196 = ZEXT3264(local_560);
      auVar199 = ZEXT3264(local_580);
      auVar197 = ZEXT3264(local_520);
      auVar198 = ZEXT3264(local_5a0);
    }
    else {
      local_5c0._0_16_ = ZEXT416(uVar172);
      local_4a0._0_16_ = auVar80;
      auVar97 = vmulps_avx512vl(local_620,auVar97);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
      auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar98);
      auVar93 = vfmadd213ps_avx512vl(auVar87,local_100,auVar88);
      auVar99 = vmulps_avx512vl(local_620,auVar99);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar99);
      auVar88 = vfmadd213ps_avx512vl(auVar102,local_120,auVar100);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1694);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1b18);
      auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar63 + 0x1f9c);
      auVar95 = vfmadd213ps_avx512vl(auVar101,local_100,auVar88);
      auVar101 = vmulps_avx512vl(local_520,auVar87);
      auVar88 = vmulps_avx512vl(local_5a0,auVar87);
      auVar87 = vmulps_avx512vl(local_620,auVar87);
      auVar82 = vfmadd231ps_fma(auVar101,auVar99,local_560);
      auVar101 = vfmadd231ps_avx512vl(auVar88,auVar99,local_580);
      auVar99 = vfmadd231ps_avx512vl(auVar87,local_140,auVar99);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar100,local_540);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_500);
      auVar88 = vfmadd231ps_avx512vl(auVar99,local_120,auVar100);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_4c0);
      auVar98 = vfmadd231ps_avx512vl(auVar101,auVar102,local_4e0);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1b18);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1f9c);
      auVar97 = vfmadd231ps_avx512vl(auVar88,local_100,auVar102);
      auVar88._4_4_ = fVar171 * auVar99._4_4_;
      auVar88._0_4_ = fVar171 * auVar99._0_4_;
      auVar88._8_4_ = fVar171 * auVar99._8_4_;
      auVar88._12_4_ = fVar171 * auVar99._12_4_;
      auVar88._16_4_ = fVar171 * auVar99._16_4_;
      auVar88._20_4_ = fVar171 * auVar99._20_4_;
      auVar88._24_4_ = fVar171 * auVar99._24_4_;
      auVar88._28_4_ = auVar102._28_4_;
      auVar102 = vmulps_avx512vl(local_5a0,auVar99);
      auVar99 = vmulps_avx512vl(local_620,auVar99);
      auVar200 = ZEXT1664(auVar80);
      auVar82 = vfmadd231ps_fma(auVar88,auVar100,local_560);
      auVar88 = vfmadd231ps_avx512vl(auVar102,auVar100,local_580);
      auVar100 = vfmadd231ps_avx512vl(auVar99,local_140,auVar100);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar63 + 0x1694);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar102,local_540);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_500);
      auVar102 = vfmadd231ps_avx512vl(auVar100,local_120,auVar102);
      auVar100 = vfmadd231ps_avx512vl(auVar99,auVar101,local_4c0);
      auVar99 = vfmadd231ps_avx512vl(auVar88,auVar101,local_4e0);
      auVar88 = vfmadd231ps_avx512vl(auVar102,local_100,auVar101);
      auVar188._8_4_ = 0x7fffffff;
      auVar188._0_8_ = 0x7fffffff7fffffff;
      auVar188._12_4_ = 0x7fffffff;
      auVar188._16_4_ = 0x7fffffff;
      auVar188._20_4_ = 0x7fffffff;
      auVar188._24_4_ = 0x7fffffff;
      auVar188._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(auVar87,auVar188);
      auVar102 = vandps_avx(auVar98,auVar188);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar101 = vandps_avx(auVar97,auVar188);
      auVar101 = vmaxps_avx(auVar102,auVar101);
      auVar97 = vbroadcastss_avx512vl(auVar80);
      uVar56 = vcmpps_avx512vl(auVar101,auVar97,1);
      bVar61 = (bool)((byte)uVar56 & 1);
      auVar114._0_4_ = (float)((uint)bVar61 * auVar91._0_4_ | (uint)!bVar61 * auVar87._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar61 * auVar91._4_4_ | (uint)!bVar61 * auVar87._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar61 * auVar91._8_4_ | (uint)!bVar61 * auVar87._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar61 * auVar91._12_4_ | (uint)!bVar61 * auVar87._12_4_);
      bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar114._16_4_ = (float)((uint)bVar61 * auVar91._16_4_ | (uint)!bVar61 * auVar87._16_4_);
      bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar114._20_4_ = (float)((uint)bVar61 * auVar91._20_4_ | (uint)!bVar61 * auVar87._20_4_);
      bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar114._24_4_ = (float)((uint)bVar61 * auVar91._24_4_ | (uint)!bVar61 * auVar87._24_4_);
      bVar61 = SUB81(uVar56 >> 7,0);
      auVar114._28_4_ = (uint)bVar61 * auVar91._28_4_ | (uint)!bVar61 * auVar87._28_4_;
      bVar61 = (bool)((byte)uVar56 & 1);
      auVar103._0_4_ = (float)((uint)bVar61 * auVar92._0_4_ | (uint)!bVar61 * auVar98._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar98._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar98._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar98._12_4_);
      bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar61 * auVar92._16_4_ | (uint)!bVar61 * auVar98._16_4_);
      bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar61 * auVar92._20_4_ | (uint)!bVar61 * auVar98._20_4_);
      bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar61 * auVar92._24_4_ | (uint)!bVar61 * auVar98._24_4_);
      bVar61 = SUB81(uVar56 >> 7,0);
      auVar103._28_4_ = (uint)bVar61 * auVar92._28_4_ | (uint)!bVar61 * auVar98._28_4_;
      auVar101 = vandps_avx(auVar188,auVar100);
      auVar102 = vandps_avx(auVar99,auVar188);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar101 = vandps_avx(auVar88,auVar188);
      auVar101 = vmaxps_avx(auVar102,auVar101);
      uVar56 = vcmpps_avx512vl(auVar101,auVar97,1);
      bVar61 = (bool)((byte)uVar56 & 1);
      auVar104._0_4_ = (float)((uint)bVar61 * auVar91._0_4_ | (uint)!bVar61 * auVar100._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar61 * auVar91._4_4_ | (uint)!bVar61 * auVar100._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar61 * auVar91._8_4_ | (uint)!bVar61 * auVar100._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar61 * auVar91._12_4_ | (uint)!bVar61 * auVar100._12_4_);
      bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar61 * auVar91._16_4_ | (uint)!bVar61 * auVar100._16_4_);
      bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar61 * auVar91._20_4_ | (uint)!bVar61 * auVar100._20_4_);
      bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar61 * auVar91._24_4_ | (uint)!bVar61 * auVar100._24_4_);
      bVar61 = SUB81(uVar56 >> 7,0);
      auVar104._28_4_ = (uint)bVar61 * auVar91._28_4_ | (uint)!bVar61 * auVar100._28_4_;
      bVar61 = (bool)((byte)uVar56 & 1);
      auVar105._0_4_ = (float)((uint)bVar61 * auVar92._0_4_ | (uint)!bVar61 * auVar99._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar99._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar99._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar99._12_4_);
      bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar61 * auVar92._16_4_ | (uint)!bVar61 * auVar99._16_4_);
      bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar61 * auVar92._20_4_ | (uint)!bVar61 * auVar99._20_4_);
      bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar61 * auVar92._24_4_ | (uint)!bVar61 * auVar99._24_4_);
      bVar61 = SUB81(uVar56 >> 7,0);
      auVar105._28_4_ = (uint)bVar61 * auVar92._28_4_ | (uint)!bVar61 * auVar99._28_4_;
      auVar86 = vxorps_avx512vl(auVar85,auVar85);
      auVar191 = ZEXT1664(auVar86);
      auVar101 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar86));
      auVar85 = vfmadd231ps_fma(auVar101,auVar103,auVar103);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
      fVar171 = auVar100._0_4_;
      fVar174 = auVar100._4_4_;
      fVar175 = auVar100._8_4_;
      fVar168 = auVar100._12_4_;
      fVar167 = auVar100._16_4_;
      fVar169 = auVar100._20_4_;
      fVar65 = auVar100._24_4_;
      auVar101._4_4_ = fVar174 * fVar174 * fVar174 * auVar85._4_4_ * -0.5;
      auVar101._0_4_ = fVar171 * fVar171 * fVar171 * auVar85._0_4_ * -0.5;
      auVar101._8_4_ = fVar175 * fVar175 * fVar175 * auVar85._8_4_ * -0.5;
      auVar101._12_4_ = fVar168 * fVar168 * fVar168 * auVar85._12_4_ * -0.5;
      auVar101._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar101._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
      auVar101._24_4_ = fVar65 * fVar65 * fVar65 * -0.0;
      auVar101._28_4_ = 0;
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar100);
      auVar102._4_4_ = auVar103._4_4_ * auVar101._4_4_;
      auVar102._0_4_ = auVar103._0_4_ * auVar101._0_4_;
      auVar102._8_4_ = auVar103._8_4_ * auVar101._8_4_;
      auVar102._12_4_ = auVar103._12_4_ * auVar101._12_4_;
      auVar102._16_4_ = auVar103._16_4_ * auVar101._16_4_;
      auVar102._20_4_ = auVar103._20_4_ * auVar101._20_4_;
      auVar102._24_4_ = auVar103._24_4_ * auVar101._24_4_;
      auVar102._28_4_ = auVar100._28_4_;
      auVar100._4_4_ = auVar101._4_4_ * -auVar114._4_4_;
      auVar100._0_4_ = auVar101._0_4_ * -auVar114._0_4_;
      auVar100._8_4_ = auVar101._8_4_ * -auVar114._8_4_;
      auVar100._12_4_ = auVar101._12_4_ * -auVar114._12_4_;
      auVar100._16_4_ = auVar101._16_4_ * -auVar114._16_4_;
      auVar100._20_4_ = auVar101._20_4_ * -auVar114._20_4_;
      auVar100._24_4_ = auVar101._24_4_ * -auVar114._24_4_;
      auVar100._28_4_ = auVar114._28_4_ ^ 0x80000000;
      auVar88 = vmulps_avx512vl(auVar101,ZEXT1632(auVar86));
      auVar91 = ZEXT1632(auVar86);
      auVar99 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar91);
      auVar85 = vfmadd231ps_fma(auVar99,auVar105,auVar105);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
      fVar171 = auVar97._0_4_;
      fVar174 = auVar97._4_4_;
      fVar175 = auVar97._8_4_;
      fVar168 = auVar97._12_4_;
      fVar167 = auVar97._16_4_;
      fVar169 = auVar97._20_4_;
      fVar65 = auVar97._24_4_;
      auVar99._4_4_ = fVar174 * fVar174 * fVar174 * auVar85._4_4_ * -0.5;
      auVar99._0_4_ = fVar171 * fVar171 * fVar171 * auVar85._0_4_ * -0.5;
      auVar99._8_4_ = fVar175 * fVar175 * fVar175 * auVar85._8_4_ * -0.5;
      auVar99._12_4_ = fVar168 * fVar168 * fVar168 * auVar85._12_4_ * -0.5;
      auVar99._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar99._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
      auVar99._24_4_ = fVar65 * fVar65 * fVar65 * -0.0;
      auVar99._28_4_ = 0;
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar97);
      auVar98._4_4_ = auVar105._4_4_ * auVar99._4_4_;
      auVar98._0_4_ = auVar105._0_4_ * auVar99._0_4_;
      auVar98._8_4_ = auVar105._8_4_ * auVar99._8_4_;
      auVar98._12_4_ = auVar105._12_4_ * auVar99._12_4_;
      auVar98._16_4_ = auVar105._16_4_ * auVar99._16_4_;
      auVar98._20_4_ = auVar105._20_4_ * auVar99._20_4_;
      auVar98._24_4_ = auVar105._24_4_ * auVar99._24_4_;
      auVar98._28_4_ = auVar97._28_4_;
      auVar97._4_4_ = -auVar104._4_4_ * auVar99._4_4_;
      auVar97._0_4_ = -auVar104._0_4_ * auVar99._0_4_;
      auVar97._8_4_ = -auVar104._8_4_ * auVar99._8_4_;
      auVar97._12_4_ = -auVar104._12_4_ * auVar99._12_4_;
      auVar97._16_4_ = -auVar104._16_4_ * auVar99._16_4_;
      auVar97._20_4_ = -auVar104._20_4_ * auVar99._20_4_;
      auVar97._24_4_ = -auVar104._24_4_ * auVar99._24_4_;
      auVar97._28_4_ = auVar101._28_4_;
      auVar101 = vmulps_avx512vl(auVar99,auVar91);
      auVar85 = vfmadd213ps_fma(auVar102,auVar94,auVar89);
      auVar82 = vfmadd213ps_fma(auVar100,auVar94,auVar90);
      auVar99 = vfmadd213ps_avx512vl(auVar88,auVar94,auVar95);
      auVar87 = vfmadd213ps_avx512vl(auVar98,ZEXT1632(auVar75),ZEXT1632(auVar73));
      auVar77 = vfnmadd213ps_fma(auVar102,auVar94,auVar89);
      auVar89 = ZEXT1632(auVar75);
      auVar81 = vfmadd213ps_fma(auVar97,auVar89,ZEXT1632(auVar74));
      auVar78 = vfnmadd213ps_fma(auVar100,auVar94,auVar90);
      auVar21 = vfmadd213ps_fma(auVar101,auVar89,auVar93);
      auVar102 = vfnmadd231ps_avx512vl(auVar95,auVar94,auVar88);
      auVar73 = vfnmadd213ps_fma(auVar98,auVar89,ZEXT1632(auVar73));
      auVar74 = vfnmadd213ps_fma(auVar97,auVar89,ZEXT1632(auVar74));
      auVar79 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar75),auVar101);
      auVar100 = vsubps_avx512vl(auVar87,ZEXT1632(auVar77));
      auVar101 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar78));
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar21),auVar102);
      auVar98 = vmulps_avx512vl(auVar101,auVar102);
      auVar76 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar78),auVar88);
      auVar89._4_4_ = auVar77._4_4_ * auVar88._4_4_;
      auVar89._0_4_ = auVar77._0_4_ * auVar88._0_4_;
      auVar89._8_4_ = auVar77._8_4_ * auVar88._8_4_;
      auVar89._12_4_ = auVar77._12_4_ * auVar88._12_4_;
      auVar89._16_4_ = auVar88._16_4_ * 0.0;
      auVar89._20_4_ = auVar88._20_4_ * 0.0;
      auVar89._24_4_ = auVar88._24_4_ * 0.0;
      auVar89._28_4_ = auVar88._28_4_;
      auVar88 = vfmsub231ps_avx512vl(auVar89,auVar102,auVar100);
      auVar90._4_4_ = auVar78._4_4_ * auVar100._4_4_;
      auVar90._0_4_ = auVar78._0_4_ * auVar100._0_4_;
      auVar90._8_4_ = auVar78._8_4_ * auVar100._8_4_;
      auVar90._12_4_ = auVar78._12_4_ * auVar100._12_4_;
      auVar90._16_4_ = auVar100._16_4_ * 0.0;
      auVar90._20_4_ = auVar100._20_4_ * 0.0;
      auVar90._24_4_ = auVar100._24_4_ * 0.0;
      auVar90._28_4_ = auVar100._28_4_;
      auVar72 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar77),auVar101);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar91,auVar88);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,ZEXT1632(auVar76));
      auVar93 = ZEXT1632(auVar86);
      uVar56 = vcmpps_avx512vl(auVar101,auVar93,2);
      bVar55 = (byte)uVar56;
      fVar65 = (float)((uint)(bVar55 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar73._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      fVar125 = (float)((uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar73._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      fVar127 = (float)((uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar73._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      fVar129 = (float)((uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar73._12_4_);
      auVar98 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar65))));
      fVar66 = (float)((uint)(bVar55 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar74._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      fVar126 = (float)((uint)bVar61 * auVar82._4_4_ | (uint)!bVar61 * auVar74._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      fVar128 = (float)((uint)bVar61 * auVar82._8_4_ | (uint)!bVar61 * auVar74._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      fVar130 = (float)((uint)bVar61 * auVar82._12_4_ | (uint)!bVar61 * auVar74._12_4_);
      auVar97 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar66))));
      auVar106._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar79._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar61 * auVar99._4_4_ | (uint)!bVar61 * auVar79._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar61 * auVar99._8_4_ | (uint)!bVar61 * auVar79._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar61 * auVar99._12_4_ | (uint)!bVar61 * auVar79._12_4_);
      fVar174 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar99._16_4_);
      auVar106._16_4_ = fVar174;
      fVar171 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar99._20_4_);
      auVar106._20_4_ = fVar171;
      fVar175 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar99._24_4_);
      auVar106._24_4_ = fVar175;
      iVar1 = (uint)(byte)(uVar56 >> 7) * auVar99._28_4_;
      auVar106._28_4_ = iVar1;
      auVar100 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar87);
      auVar107._0_4_ =
           (uint)(bVar55 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar82._0_4_;
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar61 * auVar100._4_4_ | (uint)!bVar61 * auVar82._4_4_;
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar61 * auVar100._8_4_ | (uint)!bVar61 * auVar82._8_4_;
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar61 * auVar100._12_4_ | (uint)!bVar61 * auVar82._12_4_;
      auVar107._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar100._16_4_;
      auVar107._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar100._20_4_;
      auVar107._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar100._24_4_;
      auVar107._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar100._28_4_;
      auVar100 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar81));
      auVar108._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar76._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar61 * auVar100._4_4_ | (uint)!bVar61 * auVar76._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar61 * auVar100._8_4_ | (uint)!bVar61 * auVar76._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar61 * auVar100._12_4_ | (uint)!bVar61 * auVar76._12_4_);
      fVar168 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar100._16_4_);
      auVar108._16_4_ = fVar168;
      fVar167 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar100._20_4_);
      auVar108._20_4_ = fVar167;
      fVar169 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar100._24_4_);
      auVar108._24_4_ = fVar169;
      auVar108._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar100._28_4_;
      auVar100 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar21));
      auVar109._0_4_ =
           (float)((uint)(bVar55 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar99._0_4_);
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar61 * auVar100._4_4_ | (uint)!bVar61 * auVar99._4_4_);
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar61 * auVar100._8_4_ | (uint)!bVar61 * auVar99._8_4_);
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar61 * auVar100._12_4_ | (uint)!bVar61 * auVar99._12_4_);
      bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
      auVar109._16_4_ = (float)((uint)bVar61 * auVar100._16_4_ | (uint)!bVar61 * auVar99._16_4_);
      bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
      auVar109._20_4_ = (float)((uint)bVar61 * auVar100._20_4_ | (uint)!bVar61 * auVar99._20_4_);
      bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
      auVar109._24_4_ = (float)((uint)bVar61 * auVar100._24_4_ | (uint)!bVar61 * auVar99._24_4_);
      bVar61 = SUB81(uVar56 >> 7,0);
      auVar109._28_4_ = (uint)bVar61 * auVar100._28_4_ | (uint)!bVar61 * auVar99._28_4_;
      auVar110._0_4_ =
           (uint)(bVar55 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar87._0_4_;
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar61 * (int)auVar77._4_4_ | (uint)!bVar61 * auVar87._4_4_;
      bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar61 * (int)auVar77._8_4_ | (uint)!bVar61 * auVar87._8_4_;
      bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar61 * (int)auVar77._12_4_ | (uint)!bVar61 * auVar87._12_4_;
      auVar110._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar87._16_4_;
      auVar110._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar87._20_4_;
      auVar110._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar87._24_4_;
      auVar110._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar87._28_4_;
      bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar56 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar111._0_4_ =
           (uint)(bVar55 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar21._0_4_;
      bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar21._4_4_;
      bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar21._8_4_;
      bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar21._12_4_;
      auVar111._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar102._16_4_;
      auVar111._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar102._20_4_;
      auVar111._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar102._24_4_;
      iVar2 = (uint)(byte)(uVar56 >> 7) * auVar102._28_4_;
      auVar111._28_4_ = iVar2;
      auVar89 = vsubps_avx512vl(auVar110,auVar98);
      auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar78._12_4_ |
                                               (uint)!bVar16 * auVar81._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar78._8_4_ |
                                                        (uint)!bVar14 * auVar81._8_4_,
                                                        CONCAT44((uint)bVar61 * (int)auVar78._4_4_ |
                                                                 (uint)!bVar61 * auVar81._4_4_,
                                                                 (uint)(bVar55 & 1) *
                                                                 (int)auVar78._0_4_ |
                                                                 (uint)!(bool)(bVar55 & 1) *
                                                                 auVar81._0_4_)))),auVar97);
      auVar100 = vsubps_avx(auVar111,auVar106);
      auVar99 = vsubps_avx(auVar98,auVar107);
      auVar87 = vsubps_avx(auVar97,auVar108);
      auVar88 = vsubps_avx(auVar106,auVar109);
      auVar91._4_4_ = auVar100._4_4_ * fVar125;
      auVar91._0_4_ = auVar100._0_4_ * fVar65;
      auVar91._8_4_ = auVar100._8_4_ * fVar127;
      auVar91._12_4_ = auVar100._12_4_ * fVar129;
      auVar91._16_4_ = auVar100._16_4_ * 0.0;
      auVar91._20_4_ = auVar100._20_4_ * 0.0;
      auVar91._24_4_ = auVar100._24_4_ * 0.0;
      auVar91._28_4_ = iVar2;
      auVar85 = vfmsub231ps_fma(auVar91,auVar106,auVar89);
      auVar92._4_4_ = fVar126 * auVar89._4_4_;
      auVar92._0_4_ = fVar66 * auVar89._0_4_;
      auVar92._8_4_ = fVar128 * auVar89._8_4_;
      auVar92._12_4_ = fVar130 * auVar89._12_4_;
      auVar92._16_4_ = auVar89._16_4_ * 0.0;
      auVar92._20_4_ = auVar89._20_4_ * 0.0;
      auVar92._24_4_ = auVar89._24_4_ * 0.0;
      auVar92._28_4_ = auVar101._28_4_;
      auVar82 = vfmsub231ps_fma(auVar92,auVar98,auVar102);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar93,ZEXT1632(auVar85));
      auVar156._0_4_ = auVar102._0_4_ * auVar106._0_4_;
      auVar156._4_4_ = auVar102._4_4_ * auVar106._4_4_;
      auVar156._8_4_ = auVar102._8_4_ * auVar106._8_4_;
      auVar156._12_4_ = auVar102._12_4_ * auVar106._12_4_;
      auVar156._16_4_ = auVar102._16_4_ * fVar174;
      auVar156._20_4_ = auVar102._20_4_ * fVar171;
      auVar156._24_4_ = auVar102._24_4_ * fVar175;
      auVar156._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar156,auVar97,auVar100);
      auVar90 = vfmadd231ps_avx512vl(auVar101,auVar93,ZEXT1632(auVar85));
      auVar101 = vmulps_avx512vl(auVar88,auVar107);
      auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar109);
      auVar96._4_4_ = auVar87._4_4_ * auVar109._4_4_;
      auVar96._0_4_ = auVar87._0_4_ * auVar109._0_4_;
      auVar96._8_4_ = auVar87._8_4_ * auVar109._8_4_;
      auVar96._12_4_ = auVar87._12_4_ * auVar109._12_4_;
      auVar96._16_4_ = auVar87._16_4_ * auVar109._16_4_;
      auVar96._20_4_ = auVar87._20_4_ * auVar109._20_4_;
      auVar96._24_4_ = auVar87._24_4_ * auVar109._24_4_;
      auVar96._28_4_ = auVar109._28_4_;
      auVar85 = vfmsub231ps_fma(auVar96,auVar108,auVar88);
      auVar157._0_4_ = auVar108._0_4_ * auVar99._0_4_;
      auVar157._4_4_ = auVar108._4_4_ * auVar99._4_4_;
      auVar157._8_4_ = auVar108._8_4_ * auVar99._8_4_;
      auVar157._12_4_ = auVar108._12_4_ * auVar99._12_4_;
      auVar157._16_4_ = fVar168 * auVar99._16_4_;
      auVar157._20_4_ = fVar167 * auVar99._20_4_;
      auVar157._24_4_ = fVar169 * auVar99._24_4_;
      auVar157._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar157,auVar87,auVar107);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar93,auVar101);
      auVar91 = vfmadd231ps_avx512vl(auVar101,auVar93,ZEXT1632(auVar85));
      auVar101 = vmaxps_avx(auVar90,auVar91);
      uVar139 = vcmpps_avx512vl(auVar101,auVar93,2);
      bVar64 = bVar64 & (byte)uVar139;
      auVar192 = ZEXT3264(local_4c0);
      auVar193 = ZEXT3264(local_4e0);
      auVar194 = ZEXT3264(local_540);
      auVar195 = ZEXT3264(local_500);
      auVar196 = ZEXT3264(local_560);
      auVar199 = ZEXT3264(local_580);
      auVar197 = ZEXT3264(local_520);
      auVar198 = ZEXT3264(local_5a0);
      if (bVar64 == 0) {
        bVar61 = false;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar101);
      }
      else {
        auVar31._4_4_ = auVar88._4_4_ * auVar102._4_4_;
        auVar31._0_4_ = auVar88._0_4_ * auVar102._0_4_;
        auVar31._8_4_ = auVar88._8_4_ * auVar102._8_4_;
        auVar31._12_4_ = auVar88._12_4_ * auVar102._12_4_;
        auVar31._16_4_ = auVar88._16_4_ * auVar102._16_4_;
        auVar31._20_4_ = auVar88._20_4_ * auVar102._20_4_;
        auVar31._24_4_ = auVar88._24_4_ * auVar102._24_4_;
        auVar31._28_4_ = auVar101._28_4_;
        auVar81 = vfmsub231ps_fma(auVar31,auVar87,auVar100);
        auVar32._4_4_ = auVar100._4_4_ * auVar99._4_4_;
        auVar32._0_4_ = auVar100._0_4_ * auVar99._0_4_;
        auVar32._8_4_ = auVar100._8_4_ * auVar99._8_4_;
        auVar32._12_4_ = auVar100._12_4_ * auVar99._12_4_;
        auVar32._16_4_ = auVar100._16_4_ * auVar99._16_4_;
        auVar32._20_4_ = auVar100._20_4_ * auVar99._20_4_;
        auVar32._24_4_ = auVar100._24_4_ * auVar99._24_4_;
        auVar32._28_4_ = auVar100._28_4_;
        auVar82 = vfmsub231ps_fma(auVar32,auVar89,auVar88);
        auVar33._4_4_ = auVar87._4_4_ * auVar89._4_4_;
        auVar33._0_4_ = auVar87._0_4_ * auVar89._0_4_;
        auVar33._8_4_ = auVar87._8_4_ * auVar89._8_4_;
        auVar33._12_4_ = auVar87._12_4_ * auVar89._12_4_;
        auVar33._16_4_ = auVar87._16_4_ * auVar89._16_4_;
        auVar33._20_4_ = auVar87._20_4_ * auVar89._20_4_;
        auVar33._24_4_ = auVar87._24_4_ * auVar89._24_4_;
        auVar33._28_4_ = auVar87._28_4_;
        auVar21 = vfmsub231ps_fma(auVar33,auVar99,auVar102);
        auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar21));
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar81),auVar93);
        auVar102 = vrcp14ps_avx512vl(auVar101);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar190 = ZEXT3264(auVar100);
        auVar99 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar100);
        auVar85 = vfmadd132ps_fma(auVar99,auVar102,auVar102);
        auVar34._4_4_ = auVar21._4_4_ * auVar106._4_4_;
        auVar34._0_4_ = auVar21._0_4_ * auVar106._0_4_;
        auVar34._8_4_ = auVar21._8_4_ * auVar106._8_4_;
        auVar34._12_4_ = auVar21._12_4_ * auVar106._12_4_;
        auVar34._16_4_ = fVar174 * 0.0;
        auVar34._20_4_ = fVar171 * 0.0;
        auVar34._24_4_ = fVar175 * 0.0;
        auVar34._28_4_ = iVar1;
        auVar82 = vfmadd231ps_fma(auVar34,auVar97,ZEXT1632(auVar82));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar98,ZEXT1632(auVar81));
        fVar171 = auVar85._0_4_;
        fVar174 = auVar85._4_4_;
        fVar175 = auVar85._8_4_;
        fVar168 = auVar85._12_4_;
        local_380 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar168,
                                       CONCAT48(auVar82._8_4_ * fVar175,
                                                CONCAT44(auVar82._4_4_ * fVar174,
                                                         auVar82._0_4_ * fVar171))));
        auVar170._4_4_ = uVar172;
        auVar170._0_4_ = uVar172;
        auVar170._8_4_ = uVar172;
        auVar170._12_4_ = uVar172;
        auVar170._16_4_ = uVar172;
        auVar170._20_4_ = uVar172;
        auVar170._24_4_ = uVar172;
        auVar170._28_4_ = uVar172;
        uVar139 = vcmpps_avx512vl(auVar170,local_380,2);
        uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar26._4_4_ = uVar133;
        auVar26._0_4_ = uVar133;
        auVar26._8_4_ = uVar133;
        auVar26._12_4_ = uVar133;
        auVar26._16_4_ = uVar133;
        auVar26._20_4_ = uVar133;
        auVar26._24_4_ = uVar133;
        auVar26._28_4_ = uVar133;
        uVar24 = vcmpps_avx512vl(local_380,auVar26,2);
        bVar64 = (byte)uVar139 & (byte)uVar24 & bVar64;
        if (bVar64 != 0) {
          uVar139 = vcmpps_avx512vl(auVar101,auVar93,4);
          bVar64 = bVar64 & (byte)uVar139;
          if (bVar64 != 0) {
            fVar167 = auVar90._0_4_ * fVar171;
            fVar169 = auVar90._4_4_ * fVar174;
            auVar35._4_4_ = fVar169;
            auVar35._0_4_ = fVar167;
            fVar65 = auVar90._8_4_ * fVar175;
            auVar35._8_4_ = fVar65;
            fVar66 = auVar90._12_4_ * fVar168;
            auVar35._12_4_ = fVar66;
            fVar125 = auVar90._16_4_ * 0.0;
            auVar35._16_4_ = fVar125;
            fVar126 = auVar90._20_4_ * 0.0;
            auVar35._20_4_ = fVar126;
            fVar127 = auVar90._24_4_ * 0.0;
            auVar35._24_4_ = fVar127;
            auVar35._28_4_ = auVar101._28_4_;
            auVar102 = vsubps_avx512vl(auVar100,auVar35);
            local_3c0._0_4_ =
                 (float)((uint)(bVar55 & 1) * (int)fVar167 |
                        (uint)!(bool)(bVar55 & 1) * auVar102._0_4_);
            bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
            local_3c0._4_4_ = (float)((uint)bVar61 * (int)fVar169 | (uint)!bVar61 * auVar102._4_4_);
            bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
            local_3c0._8_4_ = (float)((uint)bVar61 * (int)fVar65 | (uint)!bVar61 * auVar102._8_4_);
            bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
            local_3c0._12_4_ = (float)((uint)bVar61 * (int)fVar66 | (uint)!bVar61 * auVar102._12_4_)
            ;
            bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
            local_3c0._16_4_ =
                 (float)((uint)bVar61 * (int)fVar125 | (uint)!bVar61 * auVar102._16_4_);
            bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
            local_3c0._20_4_ =
                 (float)((uint)bVar61 * (int)fVar126 | (uint)!bVar61 * auVar102._20_4_);
            bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
            local_3c0._24_4_ =
                 (float)((uint)bVar61 * (int)fVar127 | (uint)!bVar61 * auVar102._24_4_);
            bVar61 = SUB81(uVar56 >> 7,0);
            local_3c0._28_4_ =
                 (float)((uint)bVar61 * auVar101._28_4_ | (uint)!bVar61 * auVar102._28_4_);
            auVar101 = vsubps_avx(ZEXT1632(auVar75),auVar94);
            auVar85 = vfmadd213ps_fma(auVar101,local_3c0,auVar94);
            uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar94._4_4_ = uVar133;
            auVar94._0_4_ = uVar133;
            auVar94._8_4_ = uVar133;
            auVar94._12_4_ = uVar133;
            auVar94._16_4_ = uVar133;
            auVar94._20_4_ = uVar133;
            auVar94._24_4_ = uVar133;
            auVar94._28_4_ = uVar133;
            auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                          CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                   CONCAT44(auVar85._4_4_ +
                                                                            auVar85._4_4_,
                                                                            auVar85._0_4_ +
                                                                            auVar85._0_4_)))),
                                       auVar94);
            uVar139 = vcmpps_avx512vl(local_380,auVar101,6);
            if (((byte)uVar139 & bVar64) != 0) {
              auVar152._0_4_ = auVar91._0_4_ * fVar171;
              auVar152._4_4_ = auVar91._4_4_ * fVar174;
              auVar152._8_4_ = auVar91._8_4_ * fVar175;
              auVar152._12_4_ = auVar91._12_4_ * fVar168;
              auVar152._16_4_ = auVar91._16_4_ * 0.0;
              auVar152._20_4_ = auVar91._20_4_ * 0.0;
              auVar152._24_4_ = auVar91._24_4_ * 0.0;
              auVar152._28_4_ = 0;
              auVar101 = vsubps_avx512vl(auVar100,auVar152);
              auVar112._0_4_ =
                   (uint)(bVar55 & 1) * (int)auVar152._0_4_ |
                   (uint)!(bool)(bVar55 & 1) * auVar101._0_4_;
              bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
              auVar112._4_4_ = (uint)bVar61 * (int)auVar152._4_4_ | (uint)!bVar61 * auVar101._4_4_;
              bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
              auVar112._8_4_ = (uint)bVar61 * (int)auVar152._8_4_ | (uint)!bVar61 * auVar101._8_4_;
              bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
              auVar112._12_4_ =
                   (uint)bVar61 * (int)auVar152._12_4_ | (uint)!bVar61 * auVar101._12_4_;
              bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
              auVar112._16_4_ =
                   (uint)bVar61 * (int)auVar152._16_4_ | (uint)!bVar61 * auVar101._16_4_;
              bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
              auVar112._20_4_ =
                   (uint)bVar61 * (int)auVar152._20_4_ | (uint)!bVar61 * auVar101._20_4_;
              bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
              auVar112._24_4_ =
                   (uint)bVar61 * (int)auVar152._24_4_ | (uint)!bVar61 * auVar101._24_4_;
              auVar112._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar101._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_3a0 = vfmsub132ps_avx512vl(auVar112,auVar100,auVar27);
              local_360 = 0;
              local_350 = local_630._0_8_;
              uStack_348 = local_630._8_8_;
              local_340 = local_640._0_8_;
              uStack_338 = local_640._8_8_;
              local_330 = local_650._0_8_;
              uStack_328 = local_650._8_8_;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar61 = true, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01923b9f;
                fVar149 = 1.0 / fVar149;
                local_300[0] = fVar149 * (local_3c0._0_4_ + 0.0);
                local_300[1] = fVar149 * (local_3c0._4_4_ + 1.0);
                local_300[2] = fVar149 * (local_3c0._8_4_ + 2.0);
                local_300[3] = fVar149 * (local_3c0._12_4_ + 3.0);
                fStack_2f0 = fVar149 * (local_3c0._16_4_ + 4.0);
                fStack_2ec = fVar149 * (local_3c0._20_4_ + 5.0);
                fStack_2e8 = fVar149 * (local_3c0._24_4_ + 6.0);
                fStack_2e4 = local_3c0._28_4_ + 7.0;
                local_2e0 = local_3a0;
                local_2c0 = local_380;
                local_440 = 0;
                uVar58 = (ulong)((byte)uVar139 & bVar64);
                for (uVar56 = uVar58; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000)
                {
                  local_440 = local_440 + 1;
                }
                local_460 = vpbroadcastd_avx512vl();
                local_35c = iVar7;
                while( true ) {
                  auVar80 = auVar200._0_16_;
                  auVar85 = auVar191._0_16_;
                  if (uVar58 == 0) break;
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_200 = local_300[local_440];
                  local_1e0 = *(undefined4 *)(local_2e0 + local_440 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + local_440 * 4);
                  local_680.context = context->user;
                  fVar171 = 1.0 - local_200;
                  fVar149 = fVar171 * fVar171 * -3.0;
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),
                                            ZEXT416((uint)(local_200 * fVar171)),ZEXT416(0xc0000000)
                                           );
                  auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar171)),
                                            ZEXT416((uint)(local_200 * local_200)),
                                            ZEXT416(0x40000000));
                  fVar171 = auVar80._0_4_ * 3.0;
                  fVar174 = auVar82._0_4_ * 3.0;
                  fVar175 = local_200 * local_200 * 3.0;
                  auVar163._0_4_ = fVar175 * (float)local_470._0_4_;
                  auVar163._4_4_ = fVar175 * (float)local_470._4_4_;
                  auVar163._8_4_ = fVar175 * fStack_468;
                  auVar163._12_4_ = fVar175 * fStack_464;
                  auVar135._4_4_ = fVar174;
                  auVar135._0_4_ = fVar174;
                  auVar135._8_4_ = fVar174;
                  auVar135._12_4_ = fVar174;
                  auVar80 = vfmadd132ps_fma(auVar135,auVar163,local_650);
                  auVar150._4_4_ = fVar171;
                  auVar150._0_4_ = fVar171;
                  auVar150._8_4_ = fVar171;
                  auVar150._12_4_ = fVar171;
                  auVar80 = vfmadd132ps_fma(auVar150,auVar80,local_640);
                  auVar136._4_4_ = fVar149;
                  auVar136._0_4_ = fVar149;
                  auVar136._8_4_ = fVar149;
                  auVar136._12_4_ = fVar149;
                  auVar80 = vfmadd132ps_fma(auVar136,auVar80,local_630);
                  local_260 = auVar80._0_4_;
                  auVar158._8_4_ = 1;
                  auVar158._0_8_ = 0x100000001;
                  auVar158._12_4_ = 1;
                  auVar158._16_4_ = 1;
                  auVar158._20_4_ = 1;
                  auVar158._24_4_ = 1;
                  auVar158._28_4_ = 1;
                  local_240 = vpermps_avx2(auVar158,ZEXT1632(auVar80));
                  auVar165._8_4_ = 2;
                  auVar165._0_8_ = 0x200000002;
                  auVar165._12_4_ = 2;
                  auVar165._16_4_ = 2;
                  auVar165._20_4_ = 2;
                  auVar165._24_4_ = 2;
                  auVar165._28_4_ = 2;
                  local_220 = vpermps_avx2(auVar165,ZEXT1632(auVar80));
                  uStack_25c = local_260;
                  uStack_258 = local_260;
                  uStack_254 = local_260;
                  uStack_250 = local_260;
                  uStack_24c = local_260;
                  uStack_248 = local_260;
                  uStack_244 = local_260;
                  fStack_1fc = local_200;
                  fStack_1f8 = local_200;
                  fStack_1f4 = local_200;
                  fStack_1f0 = local_200;
                  fStack_1ec = local_200;
                  fStack_1e8 = local_200;
                  fStack_1e4 = local_200;
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = local_280._0_8_;
                  uStack_1b8 = local_280._8_8_;
                  uStack_1b0 = local_280._16_8_;
                  uStack_1a8 = local_280._24_8_;
                  local_1a0 = local_460;
                  vpcmpeqd_avx2(local_460,local_460);
                  local_180 = (local_680.context)->instID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_160 = (local_680.context)->instPrimID[0];
                  uStack_15c = local_160;
                  uStack_158 = local_160;
                  uStack_154 = local_160;
                  uStack_150 = local_160;
                  uStack_14c = local_160;
                  uStack_148 = local_160;
                  uStack_144 = local_160;
                  local_600 = local_2a0;
                  local_680.valid = (int *)local_600;
                  local_680.geometryUserPtr = pGVar8->userPtr;
                  local_680.hit = (RTCHitN *)&local_260;
                  local_680.N = 8;
                  local_420 = (uint)uVar58;
                  uStack_41c = (uint)(uVar58 >> 0x20);
                  local_680.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_680);
                    uVar58 = CONCAT44(uStack_41c,local_420);
                    auVar200 = ZEXT1664(local_4a0._0_16_);
                    auVar198 = ZEXT3264(local_5a0);
                    auVar197 = ZEXT3264(local_520);
                    auVar199 = ZEXT3264(local_580);
                    auVar196 = ZEXT3264(local_560);
                    auVar195 = ZEXT3264(local_500);
                    auVar194 = ZEXT3264(local_540);
                    auVar193 = ZEXT3264(local_4e0);
                    auVar192 = ZEXT3264(local_4c0);
                    auVar80 = vxorps_avx512vl(auVar85,auVar85);
                    auVar191 = ZEXT1664(auVar80);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar190 = ZEXT3264(auVar101);
                    uVar172 = local_5c0._0_4_;
                  }
                  auVar80 = auVar191._0_16_;
                  if (local_600 != (undefined1  [32])0x0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_680);
                      uVar58 = CONCAT44(uStack_41c,local_420);
                      auVar200 = ZEXT1664(local_4a0._0_16_);
                      auVar198 = ZEXT3264(local_5a0);
                      auVar197 = ZEXT3264(local_520);
                      auVar199 = ZEXT3264(local_580);
                      auVar196 = ZEXT3264(local_560);
                      auVar195 = ZEXT3264(local_500);
                      auVar194 = ZEXT3264(local_540);
                      auVar193 = ZEXT3264(local_4e0);
                      auVar192 = ZEXT3264(local_4c0);
                      auVar80 = vxorps_avx512vl(auVar80,auVar80);
                      auVar191 = ZEXT1664(auVar80);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar190 = ZEXT3264(auVar101);
                      uVar172 = local_5c0._0_4_;
                    }
                    auVar80 = auVar200._0_16_;
                    uVar56 = vptestmd_avx512vl(local_600,local_600);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar61 = (bool)((byte)uVar56 & 1);
                    auVar113._0_4_ =
                         (uint)bVar61 * auVar101._0_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x100);
                    bVar61 = (bool)((byte)(uVar56 >> 1) & 1);
                    auVar113._4_4_ =
                         (uint)bVar61 * auVar101._4_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x104);
                    bVar61 = (bool)((byte)(uVar56 >> 2) & 1);
                    auVar113._8_4_ =
                         (uint)bVar61 * auVar101._8_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x108);
                    bVar61 = (bool)((byte)(uVar56 >> 3) & 1);
                    auVar113._12_4_ =
                         (uint)bVar61 * auVar101._12_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x10c);
                    bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
                    auVar113._16_4_ =
                         (uint)bVar61 * auVar101._16_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x110);
                    bVar61 = (bool)((byte)(uVar56 >> 5) & 1);
                    auVar113._20_4_ =
                         (uint)bVar61 * auVar101._20_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x114);
                    bVar61 = (bool)((byte)(uVar56 >> 6) & 1);
                    auVar113._24_4_ =
                         (uint)bVar61 * auVar101._24_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x118);
                    bVar61 = SUB81(uVar56 >> 7,0);
                    auVar113._28_4_ =
                         (uint)bVar61 * auVar101._28_4_ |
                         (uint)!bVar61 * *(int *)(local_680.ray + 0x11c);
                    *(undefined1 (*) [32])(local_680.ray + 0x100) = auVar113;
                    if (local_600 != (undefined1  [32])0x0) {
                      bVar61 = true;
                      goto LAB_01923b9f;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar133;
                  uVar56 = local_440 & 0x3f;
                  local_440 = 0;
                  uVar58 = uVar58 ^ 1L << uVar56;
                  for (uVar56 = uVar58; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000
                      ) {
                    local_440 = local_440 + 1;
                  }
                }
              }
            }
          }
        }
        bVar61 = false;
      }
    }
LAB_01923b9f:
    if (8 < iVar7) {
      local_4a0 = vpbroadcastd_avx512vl();
      local_5c0 = vbroadcastss_avx512vl(auVar80);
      fStack_438 = 1.0 / (float)local_400._0_4_;
      local_400 = vpbroadcastd_avx512vl();
      fStack_434 = fStack_438;
      fStack_430 = fStack_438;
      fStack_42c = fStack_438;
      fStack_428 = fStack_438;
      fStack_424 = fStack_438;
      local_420 = uVar172;
      uStack_41c = uVar172;
      uStack_418 = uVar172;
      uStack_414 = uVar172;
      uStack_410 = uVar172;
      uStack_40c = uVar172;
      uStack_408 = uVar172;
      uStack_404 = uVar172;
      local_440._0_4_ = fStack_438;
      local_440._4_4_ = fStack_438;
      for (lVar59 = 8; lVar59 < iVar7; lVar59 = lVar59 + 8) {
        auVar101 = vpbroadcastd_avx512vl();
        auVar87 = vpor_avx2(auVar101,_DAT_01fb4ba0);
        uVar24 = vpcmpd_avx512vl(auVar87,local_4a0,1);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 * 4 + lVar63);
        auVar102 = *(undefined1 (*) [32])(lVar63 + 0x21fb768 + lVar59 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar63 + 0x21fbbec + lVar59 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar63 + 0x21fc070 + lVar59 * 4);
        local_520 = auVar197._0_32_;
        auVar88 = vmulps_avx512vl(local_520,auVar99);
        auVar105 = auVar198._0_32_;
        auVar98 = vmulps_avx512vl(auVar105,auVar99);
        auVar36._4_4_ = auVar99._4_4_ * (float)local_e0._4_4_;
        auVar36._0_4_ = auVar99._0_4_ * (float)local_e0._0_4_;
        auVar36._8_4_ = auVar99._8_4_ * fStack_d8;
        auVar36._12_4_ = auVar99._12_4_ * fStack_d4;
        auVar36._16_4_ = auVar99._16_4_ * fStack_d0;
        auVar36._20_4_ = auVar99._20_4_ * fStack_cc;
        auVar36._24_4_ = auVar99._24_4_ * fStack_c8;
        auVar36._28_4_ = auVar87._28_4_;
        auVar104 = auVar196._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar88,auVar100,auVar104);
        auVar106 = auVar199._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar106);
        auVar98 = vfmadd231ps_avx512vl(auVar36,auVar100,local_c0);
        auVar103 = auVar194._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,auVar103);
        local_500 = auVar195._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_500);
        auVar80 = vfmadd231ps_fma(auVar98,auVar102,local_a0);
        local_4c0 = auVar192._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar101,local_4c0);
        local_4e0 = auVar193._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar101,local_4e0);
        auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 * 4 + lVar63);
        auVar88 = *(undefined1 (*) [32])(lVar63 + 0x21fdb88 + lVar59 * 4);
        auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar101,local_80);
        auVar98 = *(undefined1 (*) [32])(lVar63 + 0x21fe00c + lVar59 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar63 + 0x21fe490 + lVar59 * 4);
        auVar89 = vmulps_avx512vl(local_520,auVar97);
        auVar90 = vmulps_avx512vl(auVar105,auVar97);
        auVar37._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
        auVar37._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
        auVar37._8_4_ = auVar97._8_4_ * fStack_d8;
        auVar37._12_4_ = auVar97._12_4_ * fStack_d4;
        auVar37._16_4_ = auVar97._16_4_ * fStack_d0;
        auVar37._20_4_ = auVar97._20_4_ * fStack_cc;
        auVar37._24_4_ = auVar97._24_4_ * fStack_c8;
        auVar37._28_4_ = uStack_c4;
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar98,auVar104);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar106);
        auVar93 = vfmadd231ps_avx512vl(auVar37,auVar98,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar103);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,local_500);
        auVar85 = vfmadd231ps_fma(auVar93,auVar88,local_a0);
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar87,local_4c0);
        auVar94 = vfmadd231ps_avx512vl(auVar90,auVar87,local_4e0);
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar87,local_80);
        auVar95 = vmaxps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar85));
        auVar89 = vsubps_avx(auVar93,auVar91);
        auVar90 = vsubps_avx(auVar94,auVar92);
        auVar96 = vmulps_avx512vl(auVar92,auVar89);
        auVar114 = vmulps_avx512vl(auVar91,auVar90);
        auVar96 = vsubps_avx512vl(auVar96,auVar114);
        auVar114 = vmulps_avx512vl(auVar90,auVar90);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar89,auVar89);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        auVar95 = vmulps_avx512vl(auVar95,auVar114);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        uVar139 = vcmpps_avx512vl(auVar96,auVar95,2);
        bVar64 = (byte)uVar24 & (byte)uVar139;
        if (bVar64 != 0) {
          auVar97 = vmulps_avx512vl(local_620,auVar97);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar98);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_100,auVar88);
          auVar99 = vmulps_avx512vl(local_620,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar99);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_120,auVar100);
          auVar88 = vfmadd213ps_avx512vl(auVar101,local_100,auVar102);
          auVar101 = *(undefined1 (*) [32])(lVar63 + 0x21fc4f4 + lVar59 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar63 + 0x21fc978 + lVar59 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar63 + 0x21fcdfc + lVar59 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar63 + 0x21fd280 + lVar59 * 4);
          auVar98 = vmulps_avx512vl(local_520,auVar99);
          auVar97 = vmulps_avx512vl(auVar105,auVar99);
          auVar99 = vmulps_avx512vl(local_620,auVar99);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar104);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar106);
          auVar100 = vfmadd231ps_avx512vl(auVar99,local_140,auVar100);
          auVar99 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar103);
          auVar98 = vfmadd231ps_avx512vl(auVar97,auVar102,local_500);
          auVar102 = vfmadd231ps_avx512vl(auVar100,local_120,auVar102);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_4c0);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_4e0);
          auVar97 = vfmadd231ps_avx512vl(auVar102,local_100,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar63 + 0x21fe914 + lVar59 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar63 + 0x21ff21c + lVar59 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar63 + 0x21ff6a0 + lVar59 * 4);
          auVar95 = vmulps_avx512vl(local_520,auVar100);
          auVar96 = vmulps_avx512vl(auVar105,auVar100);
          auVar100 = vmulps_avx512vl(local_620,auVar100);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar104);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar106);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_140,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar63 + 0x21fed98 + lVar59 * 4);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar103);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_500);
          auVar102 = vfmadd231ps_avx512vl(auVar100,local_120,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar95,auVar101,local_4c0);
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar101,local_4e0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_100,auVar101);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar99,auVar96);
          vandps_avx512vl(auVar98,auVar96);
          auVar101 = vmaxps_avx(auVar96,auVar96);
          vandps_avx512vl(auVar97,auVar96);
          auVar101 = vmaxps_avx(auVar101,auVar96);
          uVar56 = vcmpps_avx512vl(auVar101,local_5c0,1);
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar115._0_4_ = (float)((uint)bVar13 * auVar89._0_4_ | (uint)!bVar13 * auVar99._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar99._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar99._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar99._12_4_);
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar99._16_4_);
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar99._20_4_);
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar99._24_4_);
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar115._28_4_ = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar99._28_4_;
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar116._0_4_ = (float)((uint)bVar13 * auVar90._0_4_ | (uint)!bVar13 * auVar98._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar98._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar98._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar98._12_4_);
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar13 * auVar90._16_4_ | (uint)!bVar13 * auVar98._16_4_);
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar13 * auVar90._20_4_ | (uint)!bVar13 * auVar98._20_4_);
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar13 * auVar90._24_4_ | (uint)!bVar13 * auVar98._24_4_);
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar116._28_4_ = (uint)bVar13 * auVar90._28_4_ | (uint)!bVar13 * auVar98._28_4_;
          vandps_avx512vl(auVar100,auVar96);
          vandps_avx512vl(auVar95,auVar96);
          auVar101 = vmaxps_avx(auVar116,auVar116);
          vandps_avx512vl(auVar102,auVar96);
          auVar101 = vmaxps_avx(auVar101,auVar116);
          uVar56 = vcmpps_avx512vl(auVar101,local_5c0,1);
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar117._0_4_ = (uint)bVar13 * auVar89._0_4_ | (uint)!bVar13 * auVar100._0_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar100._4_4_;
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar100._8_4_;
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar100._12_4_;
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar117._16_4_ = (uint)bVar13 * auVar89._16_4_ | (uint)!bVar13 * auVar100._16_4_;
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar117._20_4_ = (uint)bVar13 * auVar89._20_4_ | (uint)!bVar13 * auVar100._20_4_;
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar117._24_4_ = (uint)bVar13 * auVar89._24_4_ | (uint)!bVar13 * auVar100._24_4_;
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar117._28_4_ = (uint)bVar13 * auVar89._28_4_ | (uint)!bVar13 * auVar100._28_4_;
          bVar13 = (bool)((byte)uVar56 & 1);
          auVar118._0_4_ = (float)((uint)bVar13 * auVar90._0_4_ | (uint)!bVar13 * auVar95._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar95._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar95._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar95._12_4_);
          bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar13 * auVar90._16_4_ | (uint)!bVar13 * auVar95._16_4_);
          bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar13 * auVar90._20_4_ | (uint)!bVar13 * auVar95._20_4_);
          bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar13 * auVar90._24_4_ | (uint)!bVar13 * auVar95._24_4_);
          bVar13 = SUB81(uVar56 >> 7,0);
          auVar118._28_4_ = (uint)bVar13 * auVar90._28_4_ | (uint)!bVar13 * auVar95._28_4_;
          auVar177._8_4_ = 0x80000000;
          auVar177._0_8_ = 0x8000000080000000;
          auVar177._12_4_ = 0x80000000;
          auVar177._16_4_ = 0x80000000;
          auVar177._20_4_ = 0x80000000;
          auVar177._24_4_ = 0x80000000;
          auVar177._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar117,auVar177);
          auVar95 = auVar191._0_32_;
          auVar102 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar95);
          auVar82 = vfmadd231ps_fma(auVar102,auVar116,auVar116);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
          auVar189._8_4_ = 0xbf000000;
          auVar189._0_8_ = 0xbf000000bf000000;
          auVar189._12_4_ = 0xbf000000;
          auVar189._16_4_ = 0xbf000000;
          auVar189._20_4_ = 0xbf000000;
          auVar189._24_4_ = 0xbf000000;
          auVar189._28_4_ = 0xbf000000;
          fVar149 = auVar102._0_4_;
          fVar171 = auVar102._4_4_;
          fVar174 = auVar102._8_4_;
          fVar175 = auVar102._12_4_;
          fVar168 = auVar102._16_4_;
          fVar167 = auVar102._20_4_;
          fVar169 = auVar102._24_4_;
          auVar38._4_4_ = fVar171 * fVar171 * fVar171 * auVar82._4_4_ * -0.5;
          auVar38._0_4_ = fVar149 * fVar149 * fVar149 * auVar82._0_4_ * -0.5;
          auVar38._8_4_ = fVar174 * fVar174 * fVar174 * auVar82._8_4_ * -0.5;
          auVar38._12_4_ = fVar175 * fVar175 * fVar175 * auVar82._12_4_ * -0.5;
          auVar38._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar38._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar38._24_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar38._28_4_ = auVar116._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar38,auVar100,auVar102);
          auVar39._4_4_ = auVar116._4_4_ * auVar102._4_4_;
          auVar39._0_4_ = auVar116._0_4_ * auVar102._0_4_;
          auVar39._8_4_ = auVar116._8_4_ * auVar102._8_4_;
          auVar39._12_4_ = auVar116._12_4_ * auVar102._12_4_;
          auVar39._16_4_ = auVar116._16_4_ * auVar102._16_4_;
          auVar39._20_4_ = auVar116._20_4_ * auVar102._20_4_;
          auVar39._24_4_ = auVar116._24_4_ * auVar102._24_4_;
          auVar39._28_4_ = 0;
          auVar40._4_4_ = auVar102._4_4_ * -auVar115._4_4_;
          auVar40._0_4_ = auVar102._0_4_ * -auVar115._0_4_;
          auVar40._8_4_ = auVar102._8_4_ * -auVar115._8_4_;
          auVar40._12_4_ = auVar102._12_4_ * -auVar115._12_4_;
          auVar40._16_4_ = auVar102._16_4_ * -auVar115._16_4_;
          auVar40._20_4_ = auVar102._20_4_ * -auVar115._20_4_;
          auVar40._24_4_ = auVar102._24_4_ * -auVar115._24_4_;
          auVar40._28_4_ = auVar116._28_4_;
          auVar99 = vmulps_avx512vl(auVar102,auVar95);
          auVar102 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar95);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar118,auVar118);
          auVar98 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar189);
          fVar149 = auVar98._0_4_;
          fVar171 = auVar98._4_4_;
          fVar174 = auVar98._8_4_;
          fVar175 = auVar98._12_4_;
          fVar168 = auVar98._16_4_;
          fVar167 = auVar98._20_4_;
          fVar169 = auVar98._24_4_;
          auVar41._4_4_ = fVar171 * fVar171 * fVar171 * auVar102._4_4_;
          auVar41._0_4_ = fVar149 * fVar149 * fVar149 * auVar102._0_4_;
          auVar41._8_4_ = fVar174 * fVar174 * fVar174 * auVar102._8_4_;
          auVar41._12_4_ = fVar175 * fVar175 * fVar175 * auVar102._12_4_;
          auVar41._16_4_ = fVar168 * fVar168 * fVar168 * auVar102._16_4_;
          auVar41._20_4_ = fVar167 * fVar167 * fVar167 * auVar102._20_4_;
          auVar41._24_4_ = fVar169 * fVar169 * fVar169 * auVar102._24_4_;
          auVar41._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar41,auVar100,auVar98);
          auVar42._4_4_ = auVar118._4_4_ * auVar102._4_4_;
          auVar42._0_4_ = auVar118._0_4_ * auVar102._0_4_;
          auVar42._8_4_ = auVar118._8_4_ * auVar102._8_4_;
          auVar42._12_4_ = auVar118._12_4_ * auVar102._12_4_;
          auVar42._16_4_ = auVar118._16_4_ * auVar102._16_4_;
          auVar42._20_4_ = auVar118._20_4_ * auVar102._20_4_;
          auVar42._24_4_ = auVar118._24_4_ * auVar102._24_4_;
          auVar42._28_4_ = auVar98._28_4_;
          auVar43._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar43._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar43._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar43._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar43._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar43._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar43._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar43._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(auVar102,auVar95);
          auVar82 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar80),auVar91);
          auVar102 = ZEXT1632(auVar80);
          auVar81 = vfmadd213ps_fma(auVar40,auVar102,auVar92);
          auVar100 = vfmadd213ps_avx512vl(auVar99,auVar102,auVar88);
          auVar98 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar85),auVar93);
          auVar74 = vfnmadd213ps_fma(auVar39,auVar102,auVar91);
          auVar97 = ZEXT1632(auVar85);
          auVar21 = vfmadd213ps_fma(auVar43,auVar97,auVar94);
          auVar75 = vfnmadd213ps_fma(auVar40,auVar102,auVar92);
          auVar76 = vfmadd213ps_fma(auVar101,auVar97,auVar87);
          auVar92 = ZEXT1632(auVar80);
          auVar79 = vfnmadd231ps_fma(auVar88,auVar92,auVar99);
          auVar77 = vfnmadd213ps_fma(auVar42,auVar97,auVar93);
          auVar78 = vfnmadd213ps_fma(auVar43,auVar97,auVar94);
          auVar86 = vfnmadd231ps_fma(auVar87,ZEXT1632(auVar85),auVar101);
          auVar87 = vsubps_avx512vl(auVar98,ZEXT1632(auVar74));
          auVar101 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar75));
          auVar102 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar79));
          auVar44._4_4_ = auVar101._4_4_ * auVar79._4_4_;
          auVar44._0_4_ = auVar101._0_4_ * auVar79._0_4_;
          auVar44._8_4_ = auVar101._8_4_ * auVar79._8_4_;
          auVar44._12_4_ = auVar101._12_4_ * auVar79._12_4_;
          auVar44._16_4_ = auVar101._16_4_ * 0.0;
          auVar44._20_4_ = auVar101._20_4_ * 0.0;
          auVar44._24_4_ = auVar101._24_4_ * 0.0;
          auVar44._28_4_ = auVar99._28_4_;
          auVar80 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar75),auVar102);
          auVar45._4_4_ = auVar102._4_4_ * auVar74._4_4_;
          auVar45._0_4_ = auVar102._0_4_ * auVar74._0_4_;
          auVar45._8_4_ = auVar102._8_4_ * auVar74._8_4_;
          auVar45._12_4_ = auVar102._12_4_ * auVar74._12_4_;
          auVar45._16_4_ = auVar102._16_4_ * 0.0;
          auVar45._20_4_ = auVar102._20_4_ * 0.0;
          auVar45._24_4_ = auVar102._24_4_ * 0.0;
          auVar45._28_4_ = auVar102._28_4_;
          auVar72 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar79),auVar87);
          auVar46._4_4_ = auVar75._4_4_ * auVar87._4_4_;
          auVar46._0_4_ = auVar75._0_4_ * auVar87._0_4_;
          auVar46._8_4_ = auVar75._8_4_ * auVar87._8_4_;
          auVar46._12_4_ = auVar75._12_4_ * auVar87._12_4_;
          auVar46._16_4_ = auVar87._16_4_ * 0.0;
          auVar46._20_4_ = auVar87._20_4_ * 0.0;
          auVar46._24_4_ = auVar87._24_4_ * 0.0;
          auVar46._28_4_ = auVar87._28_4_;
          auVar73 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar74),auVar101);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar95,ZEXT1632(auVar72));
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,ZEXT1632(auVar80));
          uVar56 = vcmpps_avx512vl(auVar101,auVar95,2);
          bVar55 = (byte)uVar56;
          fVar125 = (float)((uint)(bVar55 & 1) * auVar82._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar77._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar127 = (float)((uint)bVar13 * auVar82._4_4_ | (uint)!bVar13 * auVar77._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar129 = (float)((uint)bVar13 * auVar82._8_4_ | (uint)!bVar13 * auVar77._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar131 = (float)((uint)bVar13 * auVar82._12_4_ | (uint)!bVar13 * auVar77._12_4_);
          auVar97 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
          fVar126 = (float)((uint)(bVar55 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar55 & 1) * auVar78._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          fVar128 = (float)((uint)bVar13 * auVar81._4_4_ | (uint)!bVar13 * auVar78._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          fVar130 = (float)((uint)bVar13 * auVar81._8_4_ | (uint)!bVar13 * auVar78._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          fVar132 = (float)((uint)bVar13 * auVar81._12_4_ | (uint)!bVar13 * auVar78._12_4_);
          auVar89 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar126))));
          auVar119._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar86._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar86._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar86._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar86._12_4_)
          ;
          fVar174 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar100._16_4_);
          auVar119._16_4_ = fVar174;
          fVar171 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar100._20_4_);
          auVar119._20_4_ = fVar171;
          fVar149 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar100._24_4_);
          auVar119._24_4_ = fVar149;
          iVar1 = (uint)(byte)(uVar56 >> 7) * auVar100._28_4_;
          auVar119._28_4_ = iVar1;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar98);
          auVar120._0_4_ =
               (uint)(bVar55 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar80._0_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar80._4_4_;
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar80._8_4_;
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar80._12_4_;
          auVar120._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * auVar101._16_4_;
          auVar120._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * auVar101._20_4_;
          auVar120._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * auVar101._24_4_;
          auVar120._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar21));
          auVar121._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar82._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar82._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar82._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar82._12_4_)
          ;
          fVar168 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar101._16_4_);
          auVar121._16_4_ = fVar168;
          fVar167 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar101._20_4_);
          auVar121._20_4_ = fVar167;
          fVar175 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar101._24_4_);
          auVar121._24_4_ = fVar175;
          auVar121._28_4_ = (uint)(byte)(uVar56 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar76));
          auVar122._0_4_ =
               (float)((uint)(bVar55 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar55 & 1) * auVar81._0_4_);
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar81._4_4_);
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar81._8_4_);
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar81._12_4_)
          ;
          fVar66 = (float)((uint)((byte)(uVar56 >> 4) & 1) * auVar101._16_4_);
          auVar122._16_4_ = fVar66;
          fVar169 = (float)((uint)((byte)(uVar56 >> 5) & 1) * auVar101._20_4_);
          auVar122._20_4_ = fVar169;
          fVar65 = (float)((uint)((byte)(uVar56 >> 6) & 1) * auVar101._24_4_);
          auVar122._24_4_ = fVar65;
          iVar2 = (uint)(byte)(uVar56 >> 7) * auVar101._28_4_;
          auVar122._28_4_ = iVar2;
          auVar123._0_4_ =
               (uint)(bVar55 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar98._0_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar13 * (int)auVar74._4_4_ | (uint)!bVar13 * auVar98._4_4_;
          bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar13 * (int)auVar74._8_4_ | (uint)!bVar13 * auVar98._8_4_;
          bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar13 * (int)auVar74._12_4_ | (uint)!bVar13 * auVar98._12_4_;
          auVar123._16_4_ = (uint)!(bool)((byte)(uVar56 >> 4) & 1) * auVar98._16_4_;
          auVar123._20_4_ = (uint)!(bool)((byte)(uVar56 >> 5) & 1) * auVar98._20_4_;
          auVar123._24_4_ = (uint)!(bool)((byte)(uVar56 >> 6) & 1) * auVar98._24_4_;
          auVar123._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar98._28_4_;
          bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar56 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar56 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar56 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar56 >> 3) & 1);
          auVar98 = vsubps_avx512vl(auVar123,auVar97);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar75._12_4_ |
                                                   (uint)!bVar17 * auVar21._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar75._8_4_ |
                                                            (uint)!bVar16 * auVar21._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar75._4_4_ |
                                                                     (uint)!bVar13 * auVar21._4_4_,
                                                                     (uint)(bVar55 & 1) *
                                                                     (int)auVar75._0_4_ |
                                                                     (uint)!(bool)(bVar55 & 1) *
                                                                     auVar21._0_4_)))),auVar89);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar79._12_4_ |
                                                   (uint)!bVar18 * auVar76._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar79._8_4_ |
                                                            (uint)!bVar15 * auVar76._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar79._4_4_ |
                                                                     (uint)!bVar14 * auVar76._4_4_,
                                                                     (uint)(bVar55 & 1) *
                                                                     (int)auVar79._0_4_ |
                                                                     (uint)!(bool)(bVar55 & 1) *
                                                                     auVar76._0_4_)))),auVar119);
          auVar99 = vsubps_avx(auVar97,auVar120);
          auVar87 = vsubps_avx(auVar89,auVar121);
          auVar88 = vsubps_avx(auVar119,auVar122);
          auVar47._4_4_ = auVar100._4_4_ * fVar127;
          auVar47._0_4_ = auVar100._0_4_ * fVar125;
          auVar47._8_4_ = auVar100._8_4_ * fVar129;
          auVar47._12_4_ = auVar100._12_4_ * fVar131;
          auVar47._16_4_ = auVar100._16_4_ * 0.0;
          auVar47._20_4_ = auVar100._20_4_ * 0.0;
          auVar47._24_4_ = auVar100._24_4_ * 0.0;
          auVar47._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar47,auVar119,auVar98);
          auVar153._0_4_ = fVar126 * auVar98._0_4_;
          auVar153._4_4_ = fVar128 * auVar98._4_4_;
          auVar153._8_4_ = fVar130 * auVar98._8_4_;
          auVar153._12_4_ = fVar132 * auVar98._12_4_;
          auVar153._16_4_ = auVar98._16_4_ * 0.0;
          auVar153._20_4_ = auVar98._20_4_ * 0.0;
          auVar153._24_4_ = auVar98._24_4_ * 0.0;
          auVar153._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar153,auVar97,auVar102);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar95,ZEXT1632(auVar80));
          auVar159._0_4_ = auVar102._0_4_ * auVar119._0_4_;
          auVar159._4_4_ = auVar102._4_4_ * auVar119._4_4_;
          auVar159._8_4_ = auVar102._8_4_ * auVar119._8_4_;
          auVar159._12_4_ = auVar102._12_4_ * auVar119._12_4_;
          auVar159._16_4_ = auVar102._16_4_ * fVar174;
          auVar159._20_4_ = auVar102._20_4_ * fVar171;
          auVar159._24_4_ = auVar102._24_4_ * fVar149;
          auVar159._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar159,auVar89,auVar100);
          auVar90 = vfmadd231ps_avx512vl(auVar101,auVar95,ZEXT1632(auVar80));
          auVar101 = vmulps_avx512vl(auVar88,auVar120);
          auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar122);
          auVar48._4_4_ = auVar87._4_4_ * auVar122._4_4_;
          auVar48._0_4_ = auVar87._0_4_ * auVar122._0_4_;
          auVar48._8_4_ = auVar87._8_4_ * auVar122._8_4_;
          auVar48._12_4_ = auVar87._12_4_ * auVar122._12_4_;
          auVar48._16_4_ = auVar87._16_4_ * fVar66;
          auVar48._20_4_ = auVar87._20_4_ * fVar169;
          auVar48._24_4_ = auVar87._24_4_ * fVar65;
          auVar48._28_4_ = iVar2;
          auVar80 = vfmsub231ps_fma(auVar48,auVar121,auVar88);
          auVar160._0_4_ = auVar121._0_4_ * auVar99._0_4_;
          auVar160._4_4_ = auVar121._4_4_ * auVar99._4_4_;
          auVar160._8_4_ = auVar121._8_4_ * auVar99._8_4_;
          auVar160._12_4_ = auVar121._12_4_ * auVar99._12_4_;
          auVar160._16_4_ = fVar168 * auVar99._16_4_;
          auVar160._20_4_ = fVar167 * auVar99._20_4_;
          auVar160._24_4_ = fVar175 * auVar99._24_4_;
          auVar160._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar160,auVar87,auVar120);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar95,auVar101);
          auVar91 = vfmadd231ps_avx512vl(auVar101,auVar95,ZEXT1632(auVar80));
          auVar101 = vmaxps_avx(auVar90,auVar91);
          uVar139 = vcmpps_avx512vl(auVar101,auVar95,2);
          bVar64 = bVar64 & (byte)uVar139;
          if (bVar64 != 0) {
            auVar49._4_4_ = auVar88._4_4_ * auVar102._4_4_;
            auVar49._0_4_ = auVar88._0_4_ * auVar102._0_4_;
            auVar49._8_4_ = auVar88._8_4_ * auVar102._8_4_;
            auVar49._12_4_ = auVar88._12_4_ * auVar102._12_4_;
            auVar49._16_4_ = auVar88._16_4_ * auVar102._16_4_;
            auVar49._20_4_ = auVar88._20_4_ * auVar102._20_4_;
            auVar49._24_4_ = auVar88._24_4_ * auVar102._24_4_;
            auVar49._28_4_ = auVar101._28_4_;
            auVar81 = vfmsub231ps_fma(auVar49,auVar87,auVar100);
            auVar50._4_4_ = auVar100._4_4_ * auVar99._4_4_;
            auVar50._0_4_ = auVar100._0_4_ * auVar99._0_4_;
            auVar50._8_4_ = auVar100._8_4_ * auVar99._8_4_;
            auVar50._12_4_ = auVar100._12_4_ * auVar99._12_4_;
            auVar50._16_4_ = auVar100._16_4_ * auVar99._16_4_;
            auVar50._20_4_ = auVar100._20_4_ * auVar99._20_4_;
            auVar50._24_4_ = auVar100._24_4_ * auVar99._24_4_;
            auVar50._28_4_ = auVar100._28_4_;
            auVar82 = vfmsub231ps_fma(auVar50,auVar98,auVar88);
            auVar51._4_4_ = auVar87._4_4_ * auVar98._4_4_;
            auVar51._0_4_ = auVar87._0_4_ * auVar98._0_4_;
            auVar51._8_4_ = auVar87._8_4_ * auVar98._8_4_;
            auVar51._12_4_ = auVar87._12_4_ * auVar98._12_4_;
            auVar51._16_4_ = auVar87._16_4_ * auVar98._16_4_;
            auVar51._20_4_ = auVar87._20_4_ * auVar98._20_4_;
            auVar51._24_4_ = auVar87._24_4_ * auVar98._24_4_;
            auVar51._28_4_ = auVar87._28_4_;
            auVar21 = vfmsub231ps_fma(auVar51,auVar99,auVar102);
            auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar21));
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar81),auVar95);
            auVar102 = vrcp14ps_avx512vl(auVar101);
            auVar99 = auVar190._0_32_;
            auVar100 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar99);
            auVar80 = vfmadd132ps_fma(auVar100,auVar102,auVar102);
            auVar52._4_4_ = auVar21._4_4_ * auVar119._4_4_;
            auVar52._0_4_ = auVar21._0_4_ * auVar119._0_4_;
            auVar52._8_4_ = auVar21._8_4_ * auVar119._8_4_;
            auVar52._12_4_ = auVar21._12_4_ * auVar119._12_4_;
            auVar52._16_4_ = fVar174 * 0.0;
            auVar52._20_4_ = fVar171 * 0.0;
            auVar52._24_4_ = fVar149 * 0.0;
            auVar52._28_4_ = iVar1;
            auVar82 = vfmadd231ps_fma(auVar52,auVar89,ZEXT1632(auVar82));
            auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar97,ZEXT1632(auVar81));
            fVar149 = auVar80._0_4_;
            fVar171 = auVar80._4_4_;
            fVar174 = auVar80._8_4_;
            fVar175 = auVar80._12_4_;
            local_380 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar175,
                                           CONCAT48(auVar82._8_4_ * fVar174,
                                                    CONCAT44(auVar82._4_4_ * fVar171,
                                                             auVar82._0_4_ * fVar149))));
            auVar54._4_4_ = uStack_41c;
            auVar54._0_4_ = local_420;
            auVar54._8_4_ = uStack_418;
            auVar54._12_4_ = uStack_414;
            auVar54._16_4_ = uStack_410;
            auVar54._20_4_ = uStack_40c;
            auVar54._24_4_ = uStack_408;
            auVar54._28_4_ = uStack_404;
            uVar139 = vcmpps_avx512vl(local_380,auVar54,0xd);
            uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar28._4_4_ = uVar133;
            auVar28._0_4_ = uVar133;
            auVar28._8_4_ = uVar133;
            auVar28._12_4_ = uVar133;
            auVar28._16_4_ = uVar133;
            auVar28._20_4_ = uVar133;
            auVar28._24_4_ = uVar133;
            auVar28._28_4_ = uVar133;
            uVar24 = vcmpps_avx512vl(local_380,auVar28,2);
            bVar64 = (byte)uVar139 & (byte)uVar24 & bVar64;
            if (bVar64 != 0) {
              uVar139 = vcmpps_avx512vl(auVar101,auVar95,4);
              bVar64 = bVar64 & (byte)uVar139;
              if (bVar64 != 0) {
                fVar168 = auVar90._0_4_ * fVar149;
                fVar167 = auVar90._4_4_ * fVar171;
                auVar53._4_4_ = fVar167;
                auVar53._0_4_ = fVar168;
                fVar169 = auVar90._8_4_ * fVar174;
                auVar53._8_4_ = fVar169;
                fVar65 = auVar90._12_4_ * fVar175;
                auVar53._12_4_ = fVar65;
                fVar66 = auVar90._16_4_ * 0.0;
                auVar53._16_4_ = fVar66;
                fVar125 = auVar90._20_4_ * 0.0;
                auVar53._20_4_ = fVar125;
                fVar126 = auVar90._24_4_ * 0.0;
                auVar53._24_4_ = fVar126;
                auVar53._28_4_ = auVar101._28_4_;
                auVar102 = vsubps_avx512vl(auVar99,auVar53);
                local_3c0._0_4_ =
                     (float)((uint)(bVar55 & 1) * (int)fVar168 |
                            (uint)!(bool)(bVar55 & 1) * auVar102._0_4_);
                bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
                local_3c0._4_4_ =
                     (float)((uint)bVar13 * (int)fVar167 | (uint)!bVar13 * auVar102._4_4_);
                bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
                local_3c0._8_4_ =
                     (float)((uint)bVar13 * (int)fVar169 | (uint)!bVar13 * auVar102._8_4_);
                bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                local_3c0._12_4_ =
                     (float)((uint)bVar13 * (int)fVar65 | (uint)!bVar13 * auVar102._12_4_);
                bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
                local_3c0._16_4_ =
                     (float)((uint)bVar13 * (int)fVar66 | (uint)!bVar13 * auVar102._16_4_);
                bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                local_3c0._20_4_ =
                     (float)((uint)bVar13 * (int)fVar125 | (uint)!bVar13 * auVar102._20_4_);
                bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
                local_3c0._24_4_ =
                     (float)((uint)bVar13 * (int)fVar126 | (uint)!bVar13 * auVar102._24_4_);
                bVar13 = SUB81(uVar56 >> 7,0);
                local_3c0._28_4_ =
                     (float)((uint)bVar13 * auVar101._28_4_ | (uint)!bVar13 * auVar102._28_4_);
                auVar101 = vsubps_avx(ZEXT1632(auVar85),auVar92);
                auVar80 = vfmadd213ps_fma(auVar101,local_3c0,auVar92);
                uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                auVar29._4_4_ = uVar133;
                auVar29._0_4_ = uVar133;
                auVar29._8_4_ = uVar133;
                auVar29._12_4_ = uVar133;
                auVar29._16_4_ = uVar133;
                auVar29._20_4_ = uVar133;
                auVar29._24_4_ = uVar133;
                auVar29._28_4_ = uVar133;
                auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                              CONCAT48(auVar80._8_4_ + auVar80._8_4_
                                                                       ,CONCAT44(auVar80._4_4_ +
                                                                                 auVar80._4_4_,
                                                                                 auVar80._0_4_ +
                                                                                 auVar80._0_4_)))),
                                           auVar29);
                uVar139 = vcmpps_avx512vl(local_380,auVar101,6);
                if (((byte)uVar139 & bVar64) != 0) {
                  auVar144._0_4_ = auVar91._0_4_ * fVar149;
                  auVar144._4_4_ = auVar91._4_4_ * fVar171;
                  auVar144._8_4_ = auVar91._8_4_ * fVar174;
                  auVar144._12_4_ = auVar91._12_4_ * fVar175;
                  auVar144._16_4_ = auVar91._16_4_ * 0.0;
                  auVar144._20_4_ = auVar91._20_4_ * 0.0;
                  auVar144._24_4_ = auVar91._24_4_ * 0.0;
                  auVar144._28_4_ = 0;
                  auVar101 = vsubps_avx512vl(auVar99,auVar144);
                  auVar124._0_4_ =
                       (uint)(bVar55 & 1) * (int)auVar144._0_4_ |
                       (uint)!(bool)(bVar55 & 1) * auVar101._0_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 1) & 1);
                  auVar124._4_4_ =
                       (uint)bVar13 * (int)auVar144._4_4_ | (uint)!bVar13 * auVar101._4_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 2) & 1);
                  auVar124._8_4_ =
                       (uint)bVar13 * (int)auVar144._8_4_ | (uint)!bVar13 * auVar101._8_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                  auVar124._12_4_ =
                       (uint)bVar13 * (int)auVar144._12_4_ | (uint)!bVar13 * auVar101._12_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 4) & 1);
                  auVar124._16_4_ =
                       (uint)bVar13 * (int)auVar144._16_4_ | (uint)!bVar13 * auVar101._16_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                  auVar124._20_4_ =
                       (uint)bVar13 * (int)auVar144._20_4_ | (uint)!bVar13 * auVar101._20_4_;
                  bVar13 = (bool)((byte)(uVar56 >> 6) & 1);
                  auVar124._24_4_ =
                       (uint)bVar13 * (int)auVar144._24_4_ | (uint)!bVar13 * auVar101._24_4_;
                  auVar124._28_4_ = (uint)!SUB81(uVar56 >> 7,0) * auVar101._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_3a0 = vfmsub132ps_avx512vl(auVar124,auVar99,auVar30);
                  local_360 = (undefined4)lVar59;
                  local_350 = local_630._0_8_;
                  uStack_348 = local_630._8_8_;
                  local_340 = local_640._0_8_;
                  uStack_338 = local_640._8_8_;
                  local_330 = local_650._0_8_;
                  uStack_328 = local_650._8_8_;
                  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    bVar55 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar55 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar80 = vcvtsi2ss_avx512f(auVar96._0_16_,local_360);
                    fVar149 = auVar80._0_4_;
                    local_300[0] = (fVar149 + local_3c0._0_4_ + 0.0) * (float)local_440;
                    local_300[1] = (fVar149 + local_3c0._4_4_ + 1.0) * local_440._4_4_;
                    local_300[2] = (fVar149 + local_3c0._8_4_ + 2.0) * fStack_438;
                    local_300[3] = (fVar149 + local_3c0._12_4_ + 3.0) * fStack_434;
                    fStack_2f0 = (fVar149 + local_3c0._16_4_ + 4.0) * fStack_430;
                    fStack_2ec = (fVar149 + local_3c0._20_4_ + 5.0) * fStack_42c;
                    fStack_2e8 = (fVar149 + local_3c0._24_4_ + 6.0) * fStack_428;
                    fStack_2e4 = fVar149 + local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    uVar56 = 0;
                    uVar60 = (ulong)((byte)uVar139 & bVar64);
                    for (uVar58 = uVar60; local_35c = iVar7, (uVar58 & 1) == 0;
                        uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                      uVar56 = uVar56 + 1;
                    }
                    while (auVar80 = auVar191._0_16_, uVar60 != 0) {
                      uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_200 = local_300[uVar56];
                      local_1e0 = *(undefined4 *)(local_2e0 + uVar56 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar56 * 4)
                      ;
                      local_680.context = context->user;
                      fVar171 = 1.0 - local_200;
                      fVar149 = fVar171 * fVar171 * -3.0;
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * fVar171)),
                                                ZEXT416((uint)(local_200 * fVar171)),
                                                ZEXT416(0xc0000000));
                      auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar171)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar171 = auVar80._0_4_ * 3.0;
                      fVar174 = auVar85._0_4_ * 3.0;
                      fVar175 = local_200 * local_200 * 3.0;
                      auVar164._0_4_ = fVar175 * (float)local_470._0_4_;
                      auVar164._4_4_ = fVar175 * (float)local_470._4_4_;
                      auVar164._8_4_ = fVar175 * fStack_468;
                      auVar164._12_4_ = fVar175 * fStack_464;
                      auVar137._4_4_ = fVar174;
                      auVar137._0_4_ = fVar174;
                      auVar137._8_4_ = fVar174;
                      auVar137._12_4_ = fVar174;
                      auVar80 = vfmadd132ps_fma(auVar137,auVar164,local_650);
                      auVar151._4_4_ = fVar171;
                      auVar151._0_4_ = fVar171;
                      auVar151._8_4_ = fVar171;
                      auVar151._12_4_ = fVar171;
                      auVar80 = vfmadd132ps_fma(auVar151,auVar80,local_640);
                      auVar138._4_4_ = fVar149;
                      auVar138._0_4_ = fVar149;
                      auVar138._8_4_ = fVar149;
                      auVar138._12_4_ = fVar149;
                      auVar80 = vfmadd132ps_fma(auVar138,auVar80,local_630);
                      local_260 = auVar80._0_4_;
                      auVar161._8_4_ = 1;
                      auVar161._0_8_ = 0x100000001;
                      auVar161._12_4_ = 1;
                      auVar161._16_4_ = 1;
                      auVar161._20_4_ = 1;
                      auVar161._24_4_ = 1;
                      auVar161._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar161,ZEXT1632(auVar80));
                      auVar166._8_4_ = 2;
                      auVar166._0_8_ = 0x200000002;
                      auVar166._12_4_ = 2;
                      auVar166._16_4_ = 2;
                      auVar166._20_4_ = 2;
                      auVar166._24_4_ = 2;
                      auVar166._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar166,ZEXT1632(auVar80));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_280._0_8_;
                      uStack_1b8 = local_280._8_8_;
                      uStack_1b0 = local_280._16_8_;
                      uStack_1a8 = local_280._24_8_;
                      local_1a0 = local_400;
                      vpcmpeqd_avx2(local_400,local_400);
                      local_180 = (local_680.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_680.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_600 = local_2a0;
                      local_680.valid = (int *)local_600;
                      local_680.geometryUserPtr = pGVar8->userPtr;
                      local_680.hit = (RTCHitN *)&local_260;
                      local_680.N = 8;
                      local_460._0_8_ = uVar56;
                      uVar58 = uVar56;
                      local_680.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_680);
                        uVar58 = local_460._0_8_;
                      }
                      if (local_600 != (undefined1  [32])0x0) {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_680);
                          uVar58 = local_460._0_8_;
                        }
                        auVar80 = auVar191._0_16_;
                        uVar56 = vptestmd_avx512vl(local_600,local_600);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar13 = (bool)((byte)uVar56 & 1);
                        bVar14 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar20 = SUB81(uVar56 >> 7,0);
                        *(uint *)(local_680.ray + 0x100) =
                             (uint)bVar13 * auVar101._0_4_ |
                             (uint)!bVar13 * *(int *)(local_680.ray + 0x100);
                        *(uint *)(local_680.ray + 0x104) =
                             (uint)bVar14 * auVar101._4_4_ |
                             (uint)!bVar14 * *(int *)(local_680.ray + 0x104);
                        *(uint *)(local_680.ray + 0x108) =
                             (uint)bVar16 * auVar101._8_4_ |
                             (uint)!bVar16 * *(int *)(local_680.ray + 0x108);
                        *(uint *)(local_680.ray + 0x10c) =
                             (uint)bVar15 * auVar101._12_4_ |
                             (uint)!bVar15 * *(int *)(local_680.ray + 0x10c);
                        *(uint *)(local_680.ray + 0x110) =
                             (uint)bVar17 * auVar101._16_4_ |
                             (uint)!bVar17 * *(int *)(local_680.ray + 0x110);
                        *(uint *)(local_680.ray + 0x114) =
                             (uint)bVar18 * auVar101._20_4_ |
                             (uint)!bVar18 * *(int *)(local_680.ray + 0x114);
                        *(uint *)(local_680.ray + 0x118) =
                             (uint)bVar19 * auVar101._24_4_ |
                             (uint)!bVar19 * *(int *)(local_680.ray + 0x118);
                        *(uint *)(local_680.ray + 0x11c) =
                             (uint)bVar20 * auVar101._28_4_ |
                             (uint)!bVar20 * *(int *)(local_680.ray + 0x11c);
                        if (local_600 != (undefined1  [32])0x0) {
                          bVar55 = 1;
                          goto LAB_019245cc;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar133;
                      uVar56 = 0;
                      uVar60 = uVar60 ^ 1L << (uVar58 & 0x3f);
                      for (uVar58 = uVar60; (uVar58 & 1) == 0;
                          uVar58 = uVar58 >> 1 | 0x8000000000000000) {
                        uVar56 = uVar56 + 1;
                      }
                    }
                    bVar55 = 0;
LAB_019245cc:
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar190 = ZEXT3264(auVar101);
                    auVar80 = vxorps_avx512vl(auVar80,auVar80);
                    auVar191 = ZEXT1664(auVar80);
                    auVar192 = ZEXT3264(local_4c0);
                    auVar193 = ZEXT3264(local_4e0);
                    auVar194 = ZEXT3264(local_540);
                    auVar195 = ZEXT3264(local_500);
                    auVar196 = ZEXT3264(local_560);
                    auVar199 = ZEXT3264(local_580);
                    auVar197 = ZEXT3264(local_520);
                    auVar198 = ZEXT3264(local_5a0);
                  }
                  bVar61 = (bool)(bVar61 | bVar55);
                }
              }
            }
          }
        }
      }
    }
    if (bVar61) break;
    uVar133 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar25._4_4_ = uVar133;
    auVar25._0_4_ = uVar133;
    auVar25._8_4_ = uVar133;
    auVar25._12_4_ = uVar133;
    uVar139 = vcmpps_avx512vl(local_3d0,auVar25,2);
  }
  return uVar62 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }